

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx2::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  int iVar63;
  uint uVar64;
  ulong uVar65;
  long lVar66;
  ulong uVar67;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  byte bVar71;
  bool bVar72;
  float fVar73;
  float fVar106;
  float fVar108;
  vint4 bi_2;
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined4 uVar74;
  undefined1 auVar92 [32];
  float fVar75;
  float fVar107;
  float fVar109;
  float fVar110;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar79 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar124 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  float fVar134;
  float fVar154;
  float fVar155;
  undefined1 auVar135 [16];
  float fVar156;
  undefined1 auVar147 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar157;
  vint4 ai_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar179;
  float fVar198;
  float fVar199;
  vint4 ai;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar200;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar201 [12];
  vint4 bi;
  undefined1 auVar210 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar211 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  vint4 ai_1;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar227 [64];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar236;
  float fVar248;
  float fVar249;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar251;
  undefined1 auVar242 [32];
  float fVar250;
  float fVar252;
  float fVar254;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar253;
  float fVar255;
  float fVar256;
  undefined1 auVar247 [64];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar263;
  float fVar264;
  undefined1 auVar261 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  float fVar285;
  float fVar286;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_d6c;
  undefined1 local_d60 [8];
  float fStack_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float fStack_d48;
  uint uStack_c84;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a30 [16];
  Primitive *local_a20;
  Primitive *local_a18;
  ulong local_a10;
  ulong local_a08;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [32];
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined4 uStack_7f0;
  undefined4 uStack_7ec;
  undefined4 uStack_7e8;
  undefined4 uStack_7e4;
  uint local_7e0;
  uint uStack_7dc;
  uint uStack_7d8;
  uint uStack_7d4;
  uint uStack_7d0;
  uint uStack_7cc;
  uint uStack_7c8;
  uint uStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined4 local_740;
  undefined4 uStack_73c;
  undefined4 uStack_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 uStack_728;
  undefined4 uStack_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar212 [32];
  undefined1 auVar262 [64];
  undefined1 auVar269 [64];
  undefined1 auVar273 [64];
  
  PVar1 = prim[1];
  uVar65 = (ulong)(byte)PVar1;
  local_a20 = prim + uVar65 * 0x19 + 0x16;
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar73 = *(float *)(prim + uVar65 * 0x19 + 0x12);
  auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])(prim + uVar65 * 0x19 + 6));
  auVar76._0_4_ = fVar73 * auVar4._0_4_;
  auVar76._4_4_ = fVar73 * auVar4._4_4_;
  auVar76._8_4_ = fVar73 * auVar4._8_4_;
  auVar76._12_4_ = fVar73 * auVar4._12_4_;
  auVar202._0_4_ = fVar73 * auVar5._0_4_;
  auVar202._4_4_ = fVar73 * auVar5._4_4_;
  auVar202._8_4_ = fVar73 * auVar5._8_4_;
  auVar202._12_4_ = fVar73 * auVar5._12_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar239 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xc + 6)));
  auVar239 = vcvtdq2ps_avx(auVar239);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xd + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x12 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x13 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x14 + 6)));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar277._4_4_ = auVar202._0_4_;
  auVar277._0_4_ = auVar202._0_4_;
  auVar277._8_4_ = auVar202._0_4_;
  auVar277._12_4_ = auVar202._0_4_;
  auVar115 = vshufps_avx(auVar202,auVar202,0x55);
  auVar81 = vshufps_avx(auVar202,auVar202,0xaa);
  fVar73 = auVar81._0_4_;
  auVar257._0_4_ = fVar73 * auVar6._0_4_;
  fVar106 = auVar81._4_4_;
  auVar257._4_4_ = fVar106 * auVar6._4_4_;
  fVar108 = auVar81._8_4_;
  auVar257._8_4_ = fVar108 * auVar6._8_4_;
  fVar179 = auVar81._12_4_;
  auVar257._12_4_ = fVar179 * auVar6._12_4_;
  auVar237._0_4_ = auVar8._0_4_ * fVar73;
  auVar237._4_4_ = auVar8._4_4_ * fVar106;
  auVar237._8_4_ = auVar8._8_4_ * fVar108;
  auVar237._12_4_ = auVar8._12_4_ * fVar179;
  auVar221._0_4_ = auVar135._0_4_ * fVar73;
  auVar221._4_4_ = auVar135._4_4_ * fVar106;
  auVar221._8_4_ = auVar135._8_4_ * fVar108;
  auVar221._12_4_ = auVar135._12_4_ * fVar179;
  auVar81 = vfmadd231ps_fma(auVar257,auVar115,auVar5);
  auVar116 = vfmadd231ps_fma(auVar237,auVar115,auVar239);
  auVar115 = vfmadd231ps_fma(auVar221,auVar77,auVar115);
  auVar139 = vfmadd231ps_fma(auVar81,auVar277,auVar4);
  auVar116 = vfmadd231ps_fma(auVar116,auVar277,auVar7);
  auVar181 = vfmadd231ps_fma(auVar115,auVar78,auVar277);
  auVar278._4_4_ = auVar76._0_4_;
  auVar278._0_4_ = auVar76._0_4_;
  auVar278._8_4_ = auVar76._0_4_;
  auVar278._12_4_ = auVar76._0_4_;
  auVar115 = vshufps_avx(auVar76,auVar76,0x55);
  auVar81 = vshufps_avx(auVar76,auVar76,0xaa);
  fVar73 = auVar81._0_4_;
  auVar203._0_4_ = fVar73 * auVar6._0_4_;
  fVar106 = auVar81._4_4_;
  auVar203._4_4_ = fVar106 * auVar6._4_4_;
  fVar108 = auVar81._8_4_;
  auVar203._8_4_ = fVar108 * auVar6._8_4_;
  fVar179 = auVar81._12_4_;
  auVar203._12_4_ = fVar179 * auVar6._12_4_;
  auVar114._0_4_ = auVar8._0_4_ * fVar73;
  auVar114._4_4_ = auVar8._4_4_ * fVar106;
  auVar114._8_4_ = auVar8._8_4_ * fVar108;
  auVar114._12_4_ = auVar8._12_4_ * fVar179;
  auVar81._0_4_ = auVar135._0_4_ * fVar73;
  auVar81._4_4_ = auVar135._4_4_ * fVar106;
  auVar81._8_4_ = auVar135._8_4_ * fVar108;
  auVar81._12_4_ = auVar135._12_4_ * fVar179;
  auVar5 = vfmadd231ps_fma(auVar203,auVar115,auVar5);
  auVar6 = vfmadd231ps_fma(auVar114,auVar115,auVar239);
  auVar239 = vfmadd231ps_fma(auVar81,auVar115,auVar77);
  auVar8 = vfmadd231ps_fma(auVar5,auVar278,auVar4);
  auVar77 = vfmadd231ps_fma(auVar6,auVar278,auVar7);
  auVar135 = vfmadd231ps_fma(auVar239,auVar278,auVar78);
  auVar231._8_4_ = 0x7fffffff;
  auVar231._0_8_ = 0x7fffffff7fffffff;
  auVar231._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx(auVar139,auVar231);
  auVar180._8_4_ = 0x219392ef;
  auVar180._0_8_ = 0x219392ef219392ef;
  auVar180._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar180,1);
  auVar5 = vblendvps_avx(auVar139,auVar180,auVar4);
  auVar4 = vandps_avx(auVar116,auVar231);
  auVar4 = vcmpps_avx(auVar4,auVar180,1);
  auVar6 = vblendvps_avx(auVar116,auVar180,auVar4);
  auVar4 = vandps_avx(auVar231,auVar181);
  auVar4 = vcmpps_avx(auVar4,auVar180,1);
  auVar4 = vblendvps_avx(auVar181,auVar180,auVar4);
  auVar7 = vrcpps_avx(auVar5);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = 0x3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar5 = vfnmadd213ps_fma(auVar5,auVar7,auVar222);
  auVar7 = vfmadd132ps_fma(auVar5,auVar7,auVar7);
  auVar5 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar5,auVar222);
  auVar239 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar5 = vrcpps_avx(auVar4);
  auVar4 = vfnmadd213ps_fma(auVar4,auVar5,auVar222);
  auVar78 = vfmadd132ps_fma(auVar4,auVar5,auVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar4 = vpmovsxwd_avx(auVar4);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar8);
  auVar181._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar181._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar181._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar181._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar4 = vpmovsxwd_avx(auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar8);
  auVar204._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar204._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar204._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar204._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar65 * 0xe + 6);
  auVar4 = vpmovsxwd_avx(auVar6);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar77);
  auVar216._0_4_ = auVar239._0_4_ * auVar4._0_4_;
  auVar216._4_4_ = auVar239._4_4_ * auVar4._4_4_;
  auVar216._8_4_ = auVar239._8_4_ * auVar4._8_4_;
  auVar216._12_4_ = auVar239._12_4_ * auVar4._12_4_;
  auVar116._1_3_ = 0;
  auVar116[0] = PVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar77);
  auVar115._0_4_ = auVar239._0_4_ * auVar4._0_4_;
  auVar115._4_4_ = auVar239._4_4_ * auVar4._4_4_;
  auVar115._8_4_ = auVar239._8_4_ * auVar4._8_4_;
  auVar115._12_4_ = auVar239._12_4_ * auVar4._12_4_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = *(ulong *)(prim + uVar65 * 0x15 + 6);
  auVar4 = vpmovsxwd_avx(auVar239);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar135);
  auVar139._0_4_ = auVar78._0_4_ * auVar4._0_4_;
  auVar139._4_4_ = auVar78._4_4_ * auVar4._4_4_;
  auVar139._8_4_ = auVar78._8_4_ * auVar4._8_4_;
  auVar139._12_4_ = auVar78._12_4_ * auVar4._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar65 * 0x17 + 6);
  auVar4 = vpmovsxwd_avx(auVar8);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar135);
  auVar77._0_4_ = auVar78._0_4_ * auVar4._0_4_;
  auVar77._4_4_ = auVar78._4_4_ * auVar4._4_4_;
  auVar77._8_4_ = auVar78._8_4_ * auVar4._8_4_;
  auVar77._12_4_ = auVar78._12_4_ * auVar4._12_4_;
  auVar4 = vpminsd_avx(auVar181,auVar204);
  auVar5 = vpminsd_avx(auVar216,auVar115);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  auVar5 = vpminsd_avx(auVar139,auVar77);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar238._4_4_ = uVar74;
  auVar238._0_4_ = uVar74;
  auVar238._8_4_ = uVar74;
  auVar238._12_4_ = uVar74;
  auVar5 = vmaxps_avx(auVar5,auVar238);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  local_840._0_4_ = auVar4._0_4_ * 0.99999964;
  local_840._4_4_ = auVar4._4_4_ * 0.99999964;
  local_840._8_4_ = auVar4._8_4_ * 0.99999964;
  local_840._12_4_ = auVar4._12_4_ * 0.99999964;
  auVar4 = vpmaxsd_avx(auVar181,auVar204);
  auVar5 = vpmaxsd_avx(auVar216,auVar115);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar5 = vpmaxsd_avx(auVar139,auVar77);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar135._4_4_ = uVar74;
  auVar135._0_4_ = uVar74;
  auVar135._8_4_ = uVar74;
  auVar135._12_4_ = uVar74;
  auVar5 = vminps_avx(auVar5,auVar135);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar78._0_4_ = auVar4._0_4_ * 1.0000004;
  auVar78._4_4_ = auVar4._4_4_ * 1.0000004;
  auVar78._8_4_ = auVar4._8_4_ * 1.0000004;
  auVar78._12_4_ = auVar4._12_4_ * 1.0000004;
  auVar116[4] = PVar1;
  auVar116._5_3_ = 0;
  auVar116[8] = PVar1;
  auVar116._9_3_ = 0;
  auVar116[0xc] = PVar1;
  auVar116._13_3_ = 0;
  auVar5 = vpcmpgtd_avx(auVar116,_DAT_01f4ad30);
  auVar4 = vcmpps_avx(local_840,auVar78,2);
  auVar4 = vandps_avx(auVar4,auVar5);
  uVar69 = vmovmskps_avx(auVar4);
  auVar90._16_16_ = mm_lookupmask_ps._240_16_;
  auVar90._0_16_ = mm_lookupmask_ps._240_16_;
  local_7a0 = vblendps_avx(auVar90,ZEXT832(0) << 0x20,0x80);
  iVar63 = 1 << ((uint)k & 0x1f);
  auVar91._4_4_ = iVar63;
  auVar91._0_4_ = iVar63;
  auVar91._8_4_ = iVar63;
  auVar91._12_4_ = iVar63;
  auVar91._16_4_ = iVar63;
  auVar91._20_4_ = iVar63;
  auVar91._24_4_ = iVar63;
  auVar91._28_4_ = iVar63;
  auVar101 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar90 = vpand_avx2(auVar91,auVar101);
  local_820 = vpcmpeqd_avx2(auVar90,auVar101);
  local_a18 = prim;
LAB_0111d3d8:
  local_a08 = (ulong)uVar69;
  if (local_a08 == 0) {
LAB_0111fb7c:
    return local_a08 != 0;
  }
  lVar66 = 0;
  for (uVar65 = local_a08; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    lVar66 = lVar66 + 1;
  }
  local_a10 = local_a08 - 1 & local_a08;
  local_800 = *(undefined4 *)(local_a18 + lVar66 * 4 + 6);
  uVar65 = (ulong)(uint)((int)lVar66 << 6);
  auVar4 = *(undefined1 (*) [16])(local_a20 + uVar65);
  if (local_a10 != 0) {
    uVar70 = local_a10 - 1 & local_a10;
    for (uVar67 = local_a10; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    }
    if (uVar70 != 0) {
      for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      }
    }
  }
  uVar69 = *(uint *)(local_a18 + 2);
  auVar5 = *(undefined1 (*) [16])(local_a20 + uVar65 + 0x10);
  auVar6 = *(undefined1 (*) [16])(local_a20 + uVar65 + 0x20);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar8 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar258._4_4_ = uVar74;
  auVar258._0_4_ = uVar74;
  auVar258._8_4_ = uVar74;
  auVar258._12_4_ = uVar74;
  fStack_9f0 = (float)uVar74;
  _local_a00 = auVar258;
  fStack_9ec = (float)uVar74;
  fStack_9e8 = (float)uVar74;
  register0x0000149c = uVar74;
  auVar262 = ZEXT3264(_local_a00);
  auVar7 = *(undefined1 (*) [16])(local_a20 + uVar65 + 0x30);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar265._4_4_ = uVar74;
  auVar265._0_4_ = uVar74;
  auVar265._8_4_ = uVar74;
  auVar265._12_4_ = uVar74;
  fStack_8f0 = (float)uVar74;
  _local_900 = auVar265;
  fStack_8ec = (float)uVar74;
  fStack_8e8 = (float)uVar74;
  register0x000014dc = uVar74;
  auVar269 = ZEXT3264(_local_900);
  auVar239 = vunpcklps_avx(auVar258,auVar265);
  fVar73 = *(float *)(ray + k * 4 + 0xc0);
  auVar270._4_4_ = fVar73;
  auVar270._0_4_ = fVar73;
  auVar270._8_4_ = fVar73;
  auVar270._12_4_ = fVar73;
  fStack_8d0 = fVar73;
  _local_8e0 = auVar270;
  fStack_8cc = fVar73;
  fStack_8c8 = fVar73;
  register0x0000151c = fVar73;
  auVar273 = ZEXT3264(_local_8e0);
  local_ab0 = vinsertps_avx(auVar239,auVar270,0x28);
  auVar205._0_4_ = (auVar4._0_4_ + auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_) * 0.25;
  auVar205._4_4_ = (auVar4._4_4_ + auVar5._4_4_ + auVar6._4_4_ + auVar7._4_4_) * 0.25;
  auVar205._8_4_ = (auVar4._8_4_ + auVar5._8_4_ + auVar6._8_4_ + auVar7._8_4_) * 0.25;
  auVar205._12_4_ = (auVar4._12_4_ + auVar5._12_4_ + auVar6._12_4_ + auVar7._12_4_) * 0.25;
  auVar239 = vsubps_avx(auVar205,auVar8);
  auVar239 = vdpps_avx(auVar239,local_ab0,0x7f);
  local_ac0 = vdpps_avx(local_ab0,local_ab0,0x7f);
  auVar247 = ZEXT1664(local_ac0);
  auVar78 = vrcpss_avx(local_ac0,local_ac0);
  auVar77 = vfnmadd213ss_fma(auVar78,local_ac0,ZEXT416(0x40000000));
  fVar106 = auVar239._0_4_ * auVar78._0_4_ * auVar77._0_4_;
  auVar215 = ZEXT464((uint)fVar106);
  auVar217._4_4_ = fVar106;
  auVar217._0_4_ = fVar106;
  auVar217._8_4_ = fVar106;
  auVar217._12_4_ = fVar106;
  auVar239 = vfmadd231ps_fma(auVar8,local_ab0,auVar217);
  auVar239 = vblendps_avx(auVar239,_DAT_01f45a50,8);
  auVar8 = vsubps_avx(auVar4,auVar239);
  auVar6 = vsubps_avx(auVar6,auVar239);
  auVar78 = vsubps_avx(auVar5,auVar239);
  auVar7 = vsubps_avx(auVar7,auVar239);
  auVar4 = vmovshdup_avx(auVar8);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vshufps_avx(auVar8,auVar8,0xaa);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar4 = vshufps_avx(auVar8,auVar8,0xff);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vmovshdup_avx(auVar78);
  local_640 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar78,auVar78,0xaa);
  local_240 = auVar4._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar4 = vshufps_avx(auVar78,auVar78,0xff);
  local_660 = auVar4._0_8_;
  auVar4 = vmovshdup_avx(auVar6);
  local_680 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar6,auVar6,0xaa);
  local_6a0 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar6,auVar6,0xff);
  local_6c0 = auVar4._0_8_;
  auVar4 = vmovshdup_avx(auVar7);
  local_6e0 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar7,auVar7,0xaa);
  local_700 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar7,auVar7,0xff);
  local_720 = auVar4._0_8_;
  auVar4 = vfmadd231ps_fma(ZEXT432((uint)(fVar73 * fVar73)),_local_900,_local_900);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_a00,_local_a00);
  uVar74 = auVar4._0_4_;
  local_260._4_4_ = uVar74;
  local_260._0_4_ = uVar74;
  local_260._8_4_ = uVar74;
  local_260._12_4_ = uVar74;
  local_260._16_4_ = uVar74;
  local_260._20_4_ = uVar74;
  local_260._24_4_ = uVar74;
  local_260._28_4_ = uVar74;
  auVar227 = ZEXT3264(local_260);
  fVar73 = *(float *)(ray + k * 4 + 0x60);
  local_a30 = ZEXT416((uint)fVar106);
  local_3a0 = fVar73 - fVar106;
  fStack_39c = local_3a0;
  fStack_398 = local_3a0;
  fStack_394 = local_3a0;
  fStack_390 = local_3a0;
  fStack_38c = local_3a0;
  fStack_388 = local_3a0;
  fStack_384 = local_3a0;
  uVar65 = 0;
  bVar71 = 0;
  local_d6c = 1;
  local_740 = auVar8._0_4_;
  local_280 = auVar78._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  local_760 = auVar6._0_4_;
  fVar108 = auVar7._0_4_;
  local_920._8_4_ = 0x7fffffff;
  local_920._0_8_ = 0x7fffffff7fffffff;
  local_920._12_4_ = 0x7fffffff;
  local_920._16_4_ = 0x7fffffff;
  local_920._20_4_ = 0x7fffffff;
  local_920._24_4_ = 0x7fffffff;
  local_920._28_4_ = 0x7fffffff;
  local_7c0 = vandps_avx(local_260,local_920);
  auVar4 = vsqrtss_avx(local_ac0,local_ac0);
  auVar5 = vsqrtss_avx(local_ac0,local_ac0);
  auVar133 = ZEXT1664(ZEXT816(0x3f80000000000000));
  uStack_7fc = local_800;
  uStack_7f8 = local_800;
  uStack_7f4 = local_800;
  uStack_7f0 = local_800;
  uStack_7ec = local_800;
  uStack_7e8 = local_800;
  uStack_7e4 = local_800;
  local_7e0 = uVar69;
  uStack_7dc = uVar69;
  uStack_7d8 = uVar69;
  uStack_7d4 = uVar69;
  uStack_7d0 = uVar69;
  uStack_7cc = uVar69;
  uStack_7c8 = uVar69;
  uStack_7c4 = uVar69;
  local_780 = fVar108;
  fStack_77c = fVar108;
  fStack_778 = fVar108;
  fStack_774 = fVar108;
  fStack_770 = fVar108;
  fStack_76c = fVar108;
  fStack_768 = fVar108;
  fStack_764 = fVar108;
  uStack_75c = local_760;
  uStack_758 = local_760;
  uStack_754 = local_760;
  uStack_750 = local_760;
  uStack_74c = local_760;
  uStack_748 = local_760;
  uStack_744 = local_760;
  uStack_73c = local_740;
  uStack_738 = local_740;
  uStack_734 = local_740;
  uStack_730 = local_740;
  uStack_72c = local_740;
  uStack_728 = local_740;
  uStack_724 = local_740;
  uStack_718 = local_720;
  uStack_710 = local_720;
  uStack_708 = local_720;
  uStack_6f8 = local_700;
  uStack_6f0 = local_700;
  uStack_6e8 = local_700;
  uStack_6d8 = local_6e0;
  uStack_6d0 = local_6e0;
  uStack_6c8 = local_6e0;
  uStack_6b8 = local_6c0;
  uStack_6b0 = local_6c0;
  uStack_6a8 = local_6c0;
  uStack_698 = local_6a0;
  uStack_690 = local_6a0;
  uStack_688 = local_6a0;
  uStack_678 = local_680;
  uStack_670 = local_680;
  uStack_668 = local_680;
  uStack_658 = local_660;
  uStack_650 = local_660;
  uStack_648 = local_660;
  uStack_638 = local_640;
  uStack_630 = local_640;
  uStack_628 = local_640;
  do {
    auVar172._8_4_ = 0x3f800000;
    auVar172._0_8_ = 0x3f8000003f800000;
    auVar172._12_4_ = 0x3f800000;
    auVar172._16_4_ = 0x3f800000;
    auVar172._20_4_ = 0x3f800000;
    auVar172._24_4_ = 0x3f800000;
    auVar172._28_4_ = 0x3f800000;
    local_830 = auVar133._0_16_;
    auVar239 = vmovshdup_avx(local_830);
    auVar239 = vsubps_avx(auVar239,local_830);
    auVar92._0_4_ = auVar239._0_4_;
    fVar157 = auVar92._0_4_ * 0.04761905;
    uVar74 = auVar133._0_4_;
    local_9c0._4_4_ = uVar74;
    local_9c0._0_4_ = uVar74;
    local_9c0._8_4_ = uVar74;
    local_9c0._12_4_ = uVar74;
    local_9c0._16_4_ = uVar74;
    local_9c0._20_4_ = uVar74;
    local_9c0._24_4_ = uVar74;
    local_9c0._28_4_ = uVar74;
    auVar92._4_4_ = auVar92._0_4_;
    auVar92._8_4_ = auVar92._0_4_;
    auVar92._12_4_ = auVar92._0_4_;
    auVar92._16_4_ = auVar92._0_4_;
    auVar92._20_4_ = auVar92._0_4_;
    auVar92._24_4_ = auVar92._0_4_;
    auVar92._28_4_ = auVar92._0_4_;
    auVar239 = vfmadd231ps_fma(local_9c0,auVar92,_DAT_01f7b040);
    auVar90 = vsubps_avx(auVar172,ZEXT1632(auVar239));
    fVar179 = auVar90._0_4_;
    fVar199 = auVar90._4_4_;
    fVar250 = auVar90._8_4_;
    fVar252 = auVar90._12_4_;
    fVar228 = auVar90._16_4_;
    fVar229 = auVar90._20_4_;
    fVar230 = auVar90._24_4_;
    fVar75 = fVar179 * fVar179 * fVar179;
    fVar107 = fVar199 * fVar199 * fVar199;
    fVar109 = fVar250 * fVar250 * fVar250;
    fVar110 = fVar252 * fVar252 * fVar252;
    fVar111 = fVar228 * fVar228 * fVar228;
    fVar112 = fVar229 * fVar229 * fVar229;
    fVar113 = fVar230 * fVar230 * fVar230;
    fVar198 = auVar239._0_4_;
    fVar200 = auVar239._4_4_;
    fVar285 = auVar239._8_4_;
    fVar286 = auVar239._12_4_;
    fVar134 = fVar198 * fVar198 * fVar198;
    fVar154 = fVar200 * fVar200 * fVar200;
    fVar155 = fVar285 * fVar285 * fVar285;
    fVar156 = fVar286 * fVar286 * fVar286;
    fVar236 = fVar179 * fVar198;
    fVar248 = fVar199 * fVar200;
    fVar249 = fVar250 * fVar285;
    fVar251 = fVar252 * fVar286;
    fVar253 = fVar228 * 0.0;
    fVar255 = fVar229 * 0.0;
    fVar256 = fVar230 * 0.0;
    fVar263 = auVar262._28_4_ + auVar273._28_4_;
    fVar264 = fVar263 + auVar92._0_4_;
    fVar254 = auVar269._28_4_;
    auVar101._4_4_ = fVar107 * 0.16666667;
    auVar101._0_4_ = fVar75 * 0.16666667;
    auVar101._8_4_ = fVar109 * 0.16666667;
    auVar101._12_4_ = fVar110 * 0.16666667;
    auVar101._16_4_ = fVar111 * 0.16666667;
    auVar101._20_4_ = fVar112 * 0.16666667;
    auVar101._24_4_ = fVar113 * 0.16666667;
    auVar101._28_4_ = fVar264;
    auVar152._4_4_ =
         (fVar199 * fVar248 * 12.0 + fVar248 * fVar200 * 6.0 + fVar154 + fVar107 * 4.0) * 0.16666667
    ;
    auVar152._0_4_ =
         (fVar179 * fVar236 * 12.0 + fVar236 * fVar198 * 6.0 + fVar134 + fVar75 * 4.0) * 0.16666667;
    auVar152._8_4_ =
         (fVar250 * fVar249 * 12.0 + fVar249 * fVar285 * 6.0 + fVar155 + fVar109 * 4.0) * 0.16666667
    ;
    auVar152._12_4_ =
         (fVar252 * fVar251 * 12.0 + fVar251 * fVar286 * 6.0 + fVar156 + fVar110 * 4.0) * 0.16666667
    ;
    auVar152._16_4_ =
         (fVar228 * fVar253 * 12.0 + fVar253 * 0.0 * 6.0 + fVar111 * 4.0 + 0.0) * 0.16666667;
    auVar152._20_4_ =
         (fVar229 * fVar255 * 12.0 + fVar255 * 0.0 * 6.0 + fVar112 * 4.0 + 0.0) * 0.16666667;
    auVar152._24_4_ =
         (fVar230 * fVar256 * 12.0 + fVar256 * 0.0 * 6.0 + fVar113 * 4.0 + 0.0) * 0.16666667;
    auVar152._28_4_ = fVar254;
    auVar9._4_4_ = (fVar154 * 4.0 + fVar107 + fVar248 * fVar200 * 12.0 + fVar199 * fVar248 * 6.0) *
                   0.16666667;
    auVar9._0_4_ = (fVar134 * 4.0 + fVar75 + fVar236 * fVar198 * 12.0 + fVar179 * fVar236 * 6.0) *
                   0.16666667;
    auVar9._8_4_ = (fVar155 * 4.0 + fVar109 + fVar249 * fVar285 * 12.0 + fVar250 * fVar249 * 6.0) *
                   0.16666667;
    auVar9._12_4_ =
         (fVar156 * 4.0 + fVar110 + fVar251 * fVar286 * 12.0 + fVar252 * fVar251 * 6.0) * 0.16666667
    ;
    auVar9._16_4_ = (fVar111 + 0.0 + fVar253 * 0.0 * 12.0 + fVar228 * fVar253 * 6.0) * 0.16666667;
    auVar9._20_4_ = (fVar112 + 0.0 + fVar255 * 0.0 * 12.0 + fVar229 * fVar255 * 6.0) * 0.16666667;
    auVar9._24_4_ = (fVar113 + 0.0 + fVar256 * 0.0 * 12.0 + fVar230 * fVar256 * 6.0) * 0.16666667;
    auVar9._28_4_ = auVar273._28_4_;
    fVar134 = fVar134 * 0.16666667;
    fVar154 = fVar154 * 0.16666667;
    fVar155 = fVar155 * 0.16666667;
    fVar156 = fVar156 * 0.16666667;
    auVar123._4_4_ = fVar154 * fStack_77c;
    auVar123._0_4_ = fVar134 * local_780;
    auVar123._8_4_ = fVar155 * fStack_778;
    auVar123._12_4_ = fVar156 * fStack_774;
    auVar123._16_4_ = fStack_770 * 0.0;
    auVar123._20_4_ = fStack_76c * 0.0;
    auVar123._24_4_ = fStack_768 * 0.0;
    auVar123._28_4_ = auVar92._0_4_;
    auVar195._4_4_ = fVar154 * local_6e0._4_4_;
    auVar195._0_4_ = fVar134 * (float)local_6e0;
    auVar195._8_4_ = fVar155 * (float)uStack_6d8;
    auVar195._12_4_ = fVar156 * uStack_6d8._4_4_;
    auVar195._16_4_ = (float)uStack_6d0 * 0.0;
    auVar195._20_4_ = uStack_6d0._4_4_ * 0.0;
    auVar195._24_4_ = (float)uStack_6c8 * 0.0;
    auVar195._28_4_ = 0x3e2aaaab;
    auVar147._4_4_ = fVar154 * local_700._4_4_;
    auVar147._0_4_ = fVar134 * (float)local_700;
    auVar147._8_4_ = fVar155 * (float)uStack_6f8;
    auVar147._12_4_ = fVar156 * uStack_6f8._4_4_;
    auVar147._16_4_ = (float)uStack_6f0 * 0.0;
    auVar147._20_4_ = uStack_6f0._4_4_ * 0.0;
    auVar147._24_4_ = (float)uStack_6e8 * 0.0;
    auVar147._28_4_ = fVar263 + auVar133._28_4_ + 0.0;
    auVar99._4_4_ = fVar154 * local_720._4_4_;
    auVar99._0_4_ = fVar134 * (float)local_720;
    auVar99._8_4_ = fVar155 * (float)uStack_718;
    auVar99._12_4_ = fVar156 * uStack_718._4_4_;
    auVar99._16_4_ = (float)uStack_710 * 0.0;
    auVar99._20_4_ = uStack_710._4_4_ * 0.0;
    auVar99._24_4_ = (float)uStack_708 * 0.0;
    auVar99._28_4_ = fVar264 + fVar254 + auVar215._28_4_;
    auVar93._4_4_ = uStack_75c;
    auVar93._0_4_ = local_760;
    auVar93._8_4_ = uStack_758;
    auVar93._12_4_ = uStack_754;
    auVar93._16_4_ = uStack_750;
    auVar93._20_4_ = uStack_74c;
    auVar93._24_4_ = uStack_748;
    auVar93._28_4_ = uStack_744;
    auVar239 = vfmadd231ps_fma(auVar123,auVar9,auVar93);
    auVar48._8_8_ = uStack_678;
    auVar48._0_8_ = local_680;
    auVar48._16_8_ = uStack_670;
    auVar48._24_8_ = uStack_668;
    auVar77 = vfmadd231ps_fma(auVar195,auVar9,auVar48);
    auVar46._8_8_ = uStack_698;
    auVar46._0_8_ = local_6a0;
    auVar46._16_8_ = uStack_690;
    auVar46._24_8_ = uStack_688;
    auVar135 = vfmadd231ps_fma(auVar147,auVar9,auVar46);
    auVar44._8_8_ = uStack_6b8;
    auVar44._0_8_ = local_6c0;
    auVar44._16_8_ = uStack_6b0;
    auVar44._24_8_ = uStack_6a8;
    auVar115 = vfmadd231ps_fma(auVar99,auVar9,auVar44);
    auVar57._4_4_ = uStack_27c;
    auVar57._0_4_ = local_280;
    auVar57._8_4_ = uStack_278;
    auVar57._12_4_ = uStack_274;
    auVar57._16_4_ = uStack_270;
    auVar57._20_4_ = uStack_26c;
    auVar57._24_4_ = uStack_268;
    auVar57._28_4_ = uStack_264;
    auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar152,auVar57);
    auVar52._8_8_ = uStack_638;
    auVar52._0_8_ = local_640;
    auVar52._16_8_ = uStack_630;
    auVar52._24_8_ = uStack_628;
    auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar152,auVar52);
    auVar58._8_8_ = uStack_238;
    auVar58._0_8_ = local_240;
    auVar58._16_8_ = uStack_230;
    auVar58._24_8_ = uStack_228;
    auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar152,auVar58);
    auVar50._8_8_ = uStack_658;
    auVar50._0_8_ = local_660;
    auVar50._16_8_ = uStack_650;
    auVar50._24_8_ = uStack_648;
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar152,auVar50);
    auVar42._4_4_ = uStack_73c;
    auVar42._0_4_ = local_740;
    auVar42._8_4_ = uStack_738;
    auVar42._12_4_ = uStack_734;
    auVar42._16_4_ = uStack_730;
    auVar42._20_4_ = uStack_72c;
    auVar42._24_4_ = uStack_728;
    auVar42._28_4_ = uStack_724;
    auVar239 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar101,auVar42);
    auVar93 = ZEXT1632(auVar239);
    auVar61._8_8_ = uStack_1d8;
    auVar61._0_8_ = local_1e0;
    auVar61._16_8_ = uStack_1d0;
    auVar61._24_8_ = uStack_1c8;
    auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar101,auVar61);
    auVar60._8_8_ = uStack_1f8;
    auVar60._0_8_ = local_200;
    auVar60._16_8_ = uStack_1f0;
    auVar60._24_8_ = uStack_1e8;
    auVar239 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar101,auVar60);
    auVar59._8_8_ = uStack_218;
    auVar59._0_8_ = local_220;
    auVar59._16_8_ = uStack_210;
    auVar59._24_8_ = uStack_208;
    auVar135 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar59,auVar101);
    auVar218._0_4_ = -fVar198 * fVar198;
    auVar218._4_4_ = -fVar200 * fVar200;
    auVar218._8_4_ = -fVar285 * fVar285;
    auVar218._12_4_ = -fVar286 * fVar286;
    auVar218._16_4_ = 0x80000000;
    auVar218._20_4_ = 0x80000000;
    auVar218._24_4_ = 0x80000000;
    auVar218._28_4_ = 0;
    auVar122._4_4_ = fVar248 * 4.0;
    auVar122._0_4_ = fVar236 * 4.0;
    auVar122._8_4_ = fVar249 * 4.0;
    auVar122._12_4_ = fVar251 * 4.0;
    auVar122._16_4_ = fVar253 * 4.0;
    auVar122._20_4_ = fVar255 * 4.0;
    auVar122._24_4_ = fVar256 * 4.0;
    auVar122._28_4_ = auVar247._28_4_;
    auVar101 = vsubps_avx(auVar218,auVar122);
    auVar194._4_4_ = fVar199 * -fVar199 * 0.5;
    auVar194._0_4_ = fVar179 * -fVar179 * 0.5;
    auVar194._8_4_ = fVar250 * -fVar250 * 0.5;
    auVar194._12_4_ = fVar252 * -fVar252 * 0.5;
    auVar194._16_4_ = fVar228 * -fVar228 * 0.5;
    auVar194._20_4_ = fVar229 * -fVar229 * 0.5;
    auVar194._24_4_ = fVar230 * -fVar230 * 0.5;
    auVar194._28_4_ = auVar90._28_4_;
    auVar10._4_4_ = auVar101._4_4_ * 0.5;
    auVar10._0_4_ = auVar101._0_4_ * 0.5;
    auVar10._8_4_ = auVar101._8_4_ * 0.5;
    auVar10._12_4_ = auVar101._12_4_ * 0.5;
    auVar10._16_4_ = auVar101._16_4_ * 0.5;
    auVar10._20_4_ = auVar101._20_4_ * 0.5;
    auVar10._24_4_ = auVar101._24_4_ * 0.5;
    auVar10._28_4_ = auVar101._28_4_;
    auVar121._4_4_ = (fVar248 * 4.0 + fVar199 * fVar199) * 0.5;
    auVar121._0_4_ = (fVar236 * 4.0 + fVar179 * fVar179) * 0.5;
    auVar121._8_4_ = (fVar249 * 4.0 + fVar250 * fVar250) * 0.5;
    auVar121._12_4_ = (fVar251 * 4.0 + fVar252 * fVar252) * 0.5;
    auVar121._16_4_ = (fVar253 * 4.0 + fVar228 * fVar228) * 0.5;
    auVar121._20_4_ = (fVar255 * 4.0 + fVar229 * fVar229) * 0.5;
    auVar121._24_4_ = (fVar256 * 4.0 + fVar230 * fVar230) * 0.5;
    auVar121._28_4_ = auVar247._28_4_ + auVar227._28_4_;
    fVar179 = fVar198 * fVar198 * 0.5;
    fVar198 = fVar200 * fVar200 * 0.5;
    fVar199 = fVar285 * fVar285 * 0.5;
    fVar200 = fVar286 * fVar286 * 0.5;
    auVar210._4_4_ = fVar198 * fStack_77c;
    auVar210._0_4_ = fVar179 * local_780;
    auVar210._8_4_ = fVar199 * fStack_778;
    auVar210._12_4_ = fVar200 * fStack_774;
    auVar210._16_4_ = fStack_770 * 0.0;
    auVar210._20_4_ = fStack_76c * 0.0;
    auVar210._24_4_ = fStack_768 * 0.0;
    auVar210._28_4_ = 0x3f000000;
    auVar279._4_4_ = fVar198 * local_6e0._4_4_;
    auVar279._0_4_ = fVar179 * (float)local_6e0;
    auVar279._8_4_ = fVar199 * (float)uStack_6d8;
    auVar279._12_4_ = fVar200 * uStack_6d8._4_4_;
    auVar279._16_4_ = (float)uStack_6d0 * 0.0;
    auVar279._20_4_ = uStack_6d0._4_4_ * 0.0;
    auVar279._24_4_ = (float)uStack_6c8 * 0.0;
    auVar279._28_4_ = 0x80000000;
    auVar226._4_4_ = fVar198 * local_700._4_4_;
    auVar226._0_4_ = fVar179 * (float)local_700;
    auVar226._8_4_ = fVar199 * (float)uStack_6f8;
    auVar226._12_4_ = fVar200 * uStack_6f8._4_4_;
    auVar226._16_4_ = (float)uStack_6f0 * 0.0;
    auVar226._20_4_ = uStack_6f0._4_4_ * 0.0;
    auVar226._24_4_ = (float)uStack_6e8 * 0.0;
    auVar226._28_4_ = fVar254;
    auVar192._4_4_ = fVar198 * local_720._4_4_;
    auVar192._0_4_ = fVar179 * (float)local_720;
    auVar192._8_4_ = fVar199 * (float)uStack_718;
    auVar192._12_4_ = fVar200 * uStack_718._4_4_;
    auVar192._16_4_ = (float)uStack_710 * 0.0;
    auVar192._20_4_ = uStack_710._4_4_ * 0.0;
    auVar192._24_4_ = (float)uStack_708 * 0.0;
    auVar192._28_4_ = DAT_01f7b040._28_4_;
    auVar41._4_4_ = uStack_75c;
    auVar41._0_4_ = local_760;
    auVar41._8_4_ = uStack_758;
    auVar41._12_4_ = uStack_754;
    auVar41._16_4_ = uStack_750;
    auVar41._20_4_ = uStack_74c;
    auVar41._24_4_ = uStack_748;
    auVar41._28_4_ = uStack_744;
    auVar115 = vfmadd231ps_fma(auVar210,auVar121,auVar41);
    auVar49._8_8_ = uStack_678;
    auVar49._0_8_ = local_680;
    auVar49._16_8_ = uStack_670;
    auVar49._24_8_ = uStack_668;
    auVar81 = vfmadd231ps_fma(auVar279,auVar121,auVar49);
    auVar47._8_8_ = uStack_698;
    auVar47._0_8_ = local_6a0;
    auVar47._16_8_ = uStack_690;
    auVar47._24_8_ = uStack_688;
    auVar116 = vfmadd231ps_fma(auVar226,auVar121,auVar47);
    auVar45._8_8_ = uStack_6b8;
    auVar45._0_8_ = local_6c0;
    auVar45._16_8_ = uStack_6b0;
    auVar45._24_8_ = uStack_6a8;
    auVar139 = vfmadd231ps_fma(auVar192,auVar121,auVar45);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar10,auVar57);
    auVar53._8_8_ = uStack_638;
    auVar53._0_8_ = local_640;
    auVar53._16_8_ = uStack_630;
    auVar53._24_8_ = uStack_628;
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar10,auVar53);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar10,auVar58);
    auVar51._8_8_ = uStack_658;
    auVar51._0_8_ = local_660;
    auVar51._16_8_ = uStack_650;
    auVar51._24_8_ = uStack_648;
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar10,auVar51);
    auVar43._4_4_ = uStack_73c;
    auVar43._0_4_ = local_740;
    auVar43._8_4_ = uStack_738;
    auVar43._12_4_ = uStack_734;
    auVar43._16_4_ = uStack_730;
    auVar43._20_4_ = uStack_72c;
    auVar43._24_4_ = uStack_728;
    auVar43._28_4_ = uStack_724;
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar194,auVar43);
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar194,auVar61);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar194,auVar60);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar59,auVar194);
    auVar242._0_4_ = auVar115._0_4_ * fVar157;
    auVar242._4_4_ = auVar115._4_4_ * fVar157;
    auVar242._8_4_ = auVar115._8_4_ * fVar157;
    auVar242._12_4_ = auVar115._12_4_ * fVar157;
    auVar242._16_4_ = fVar157 * 0.0;
    auVar242._20_4_ = fVar157 * 0.0;
    auVar242._24_4_ = fVar157 * 0.0;
    auVar242._28_4_ = 0;
    fVar198 = auVar81._0_4_ * fVar157;
    fVar200 = auVar81._4_4_ * fVar157;
    local_980._4_4_ = fVar200;
    local_980._0_4_ = fVar198;
    fVar285 = auVar81._8_4_ * fVar157;
    local_980._8_4_ = fVar285;
    fVar286 = auVar81._12_4_ * fVar157;
    local_980._12_4_ = fVar286;
    local_980._16_4_ = fVar157 * 0.0;
    local_980._20_4_ = fVar157 * 0.0;
    local_980._24_4_ = fVar157 * 0.0;
    local_980._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar266._0_4_ = auVar116._0_4_ * fVar157;
    auVar266._4_4_ = auVar116._4_4_ * fVar157;
    auVar266._8_4_ = auVar116._8_4_ * fVar157;
    auVar266._12_4_ = auVar116._12_4_ * fVar157;
    auVar266._16_4_ = fVar157 * 0.0;
    auVar266._20_4_ = fVar157 * 0.0;
    auVar266._24_4_ = fVar157 * 0.0;
    auVar266._28_4_ = 0;
    auVar190._0_4_ = fVar157 * auVar139._0_4_;
    auVar190._4_4_ = fVar157 * auVar139._4_4_;
    auVar190._8_4_ = fVar157 * auVar139._8_4_;
    auVar190._12_4_ = fVar157 * auVar139._12_4_;
    auVar190._16_4_ = fVar157 * 0.0;
    auVar190._20_4_ = fVar157 * 0.0;
    auVar190._24_4_ = fVar157 * 0.0;
    auVar190._28_4_ = 0;
    auVar147 = vpermps_avx2(_DAT_01fb7720,auVar93);
    auVar121 = ZEXT1632(auVar239);
    auVar99 = vpermps_avx2(_DAT_01fb7720,auVar121);
    local_320 = vsubps_avx(auVar147,auVar93);
    local_300 = vsubps_avx(auVar99,ZEXT1632(auVar239));
    fVar107 = local_300._0_4_;
    fVar109 = local_300._4_4_;
    auVar11._4_4_ = fVar109 * auVar242._4_4_;
    auVar11._0_4_ = fVar107 * auVar242._0_4_;
    fVar112 = local_300._8_4_;
    auVar11._8_4_ = fVar112 * auVar242._8_4_;
    fVar134 = local_300._12_4_;
    auVar11._12_4_ = fVar134 * auVar242._12_4_;
    fVar154 = local_300._16_4_;
    auVar11._16_4_ = fVar154 * auVar242._16_4_;
    fVar155 = local_300._20_4_;
    auVar11._20_4_ = fVar155 * auVar242._20_4_;
    fVar156 = local_300._24_4_;
    auVar11._24_4_ = fVar156 * auVar242._24_4_;
    auVar11._28_4_ = auVar101._28_4_;
    auVar239 = vfmsub231ps_fma(auVar11,auVar266,local_320);
    local_960 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar77));
    local_340 = vsubps_avx(local_960,ZEXT1632(auVar77));
    fVar179 = local_320._0_4_;
    fVar199 = local_320._4_4_;
    auVar12._4_4_ = fVar200 * fVar199;
    auVar12._0_4_ = fVar198 * fVar179;
    fVar250 = local_320._8_4_;
    auVar12._8_4_ = fVar285 * fVar250;
    fVar252 = local_320._12_4_;
    auVar12._12_4_ = fVar286 * fVar252;
    fVar228 = local_320._16_4_;
    auVar12._16_4_ = fVar157 * 0.0 * fVar228;
    fVar229 = local_320._20_4_;
    auVar12._20_4_ = fVar157 * 0.0 * fVar229;
    fVar230 = local_320._24_4_;
    auVar12._24_4_ = fVar157 * 0.0 * fVar230;
    auVar12._28_4_ = local_960._28_4_;
    auVar115 = vfmsub231ps_fma(auVar12,auVar242,local_340);
    auVar239 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar115._12_4_ * auVar115._12_4_,
                                                  CONCAT48(auVar115._8_4_ * auVar115._8_4_,
                                                           CONCAT44(auVar115._4_4_ * auVar115._4_4_,
                                                                    auVar115._0_4_ * auVar115._0_4_)
                                                          ))),ZEXT1632(auVar239),ZEXT1632(auVar239))
    ;
    fVar110 = local_340._0_4_;
    auVar219._0_4_ = fVar110 * auVar266._0_4_;
    fVar111 = local_340._4_4_;
    auVar219._4_4_ = fVar111 * auVar266._4_4_;
    fVar113 = local_340._8_4_;
    auVar219._8_4_ = fVar113 * auVar266._8_4_;
    fVar236 = local_340._12_4_;
    auVar219._12_4_ = fVar236 * auVar266._12_4_;
    fVar248 = local_340._16_4_;
    auVar219._16_4_ = fVar248 * auVar266._16_4_;
    fVar249 = local_340._20_4_;
    auVar219._20_4_ = fVar249 * auVar266._20_4_;
    fVar251 = local_340._24_4_;
    auVar219._24_4_ = fVar251 * auVar266._24_4_;
    auVar219._28_4_ = 0;
    auVar115 = vfmsub231ps_fma(auVar219,local_980,local_300);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar239),ZEXT1632(auVar115),ZEXT1632(auVar115));
    auVar220._0_4_ = fVar107 * fVar107;
    auVar220._4_4_ = fVar109 * fVar109;
    auVar220._8_4_ = fVar112 * fVar112;
    auVar220._12_4_ = fVar134 * fVar134;
    auVar220._16_4_ = fVar154 * fVar154;
    auVar220._20_4_ = fVar155 * fVar155;
    auVar220._24_4_ = fVar156 * fVar156;
    auVar220._28_4_ = 0;
    auVar239 = vfmadd231ps_fma(auVar220,local_340,local_340);
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar239),local_320,local_320);
    auVar90 = vrcpps_avx(ZEXT1632(auVar81));
    auVar94._8_4_ = 0x3f800000;
    auVar94._0_8_ = 0x3f8000003f800000;
    auVar94._12_4_ = 0x3f800000;
    auVar94._16_4_ = 0x3f800000;
    auVar94._20_4_ = 0x3f800000;
    auVar94._24_4_ = 0x3f800000;
    auVar94._28_4_ = 0x3f800000;
    auVar239 = vfnmadd213ps_fma(auVar90,ZEXT1632(auVar81),auVar94);
    auVar239 = vfmadd132ps_fma(ZEXT1632(auVar239),auVar90,auVar90);
    auVar122 = vpermps_avx2(_DAT_01fb7720,auVar242);
    local_ae0 = vpermps_avx2(_DAT_01fb7720,auVar266);
    auVar13._4_4_ = fVar109 * auVar122._4_4_;
    auVar13._0_4_ = fVar107 * auVar122._0_4_;
    auVar13._8_4_ = fVar112 * auVar122._8_4_;
    auVar13._12_4_ = fVar134 * auVar122._12_4_;
    auVar13._16_4_ = fVar154 * auVar122._16_4_;
    auVar13._20_4_ = fVar155 * auVar122._20_4_;
    auVar13._24_4_ = fVar156 * auVar122._24_4_;
    auVar13._28_4_ = auVar90._28_4_;
    auVar116 = vfmsub231ps_fma(auVar13,local_ae0,local_320);
    local_b00 = vpermps_avx2(_DAT_01fb7720,local_980);
    auVar14._4_4_ = fVar199 * local_b00._4_4_;
    auVar14._0_4_ = fVar179 * local_b00._0_4_;
    auVar14._8_4_ = fVar250 * local_b00._8_4_;
    auVar14._12_4_ = fVar252 * local_b00._12_4_;
    auVar14._16_4_ = fVar228 * local_b00._16_4_;
    auVar14._20_4_ = fVar229 * local_b00._20_4_;
    auVar14._24_4_ = fVar230 * local_b00._24_4_;
    auVar14._28_4_ = 0;
    auVar139 = vfmsub231ps_fma(auVar14,auVar122,local_340);
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar139._12_4_ * auVar139._12_4_,
                                                  CONCAT48(auVar139._8_4_ * auVar139._8_4_,
                                                           CONCAT44(auVar139._4_4_ * auVar139._4_4_,
                                                                    auVar139._0_4_ * auVar139._0_4_)
                                                          ))),ZEXT1632(auVar116),ZEXT1632(auVar116))
    ;
    auVar223._0_4_ = fVar110 * local_ae0._0_4_;
    auVar223._4_4_ = fVar111 * local_ae0._4_4_;
    auVar223._8_4_ = fVar113 * local_ae0._8_4_;
    auVar223._12_4_ = fVar236 * local_ae0._12_4_;
    auVar223._16_4_ = fVar248 * local_ae0._16_4_;
    auVar223._20_4_ = fVar249 * local_ae0._20_4_;
    auVar223._24_4_ = fVar251 * local_ae0._24_4_;
    auVar223._28_4_ = 0;
    auVar139 = vfmsub231ps_fma(auVar223,local_b00,local_300);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),ZEXT1632(auVar139),ZEXT1632(auVar139));
    auVar90 = vmaxps_avx(ZEXT1632(CONCAT412(auVar239._12_4_ * auVar115._12_4_,
                                            CONCAT48(auVar239._8_4_ * auVar115._8_4_,
                                                     CONCAT44(auVar239._4_4_ * auVar115._4_4_,
                                                              auVar239._0_4_ * auVar115._0_4_)))),
                         ZEXT1632(CONCAT412(auVar116._12_4_ * auVar239._12_4_,
                                            CONCAT48(auVar116._8_4_ * auVar239._8_4_,
                                                     CONCAT44(auVar116._4_4_ * auVar239._4_4_,
                                                              auVar116._0_4_ * auVar239._0_4_)))));
    auVar224._0_4_ = auVar190._0_4_ + auVar135._0_4_;
    auVar224._4_4_ = auVar190._4_4_ + auVar135._4_4_;
    auVar224._8_4_ = auVar190._8_4_ + auVar135._8_4_;
    auVar224._12_4_ = auVar190._12_4_ + auVar135._12_4_;
    auVar224._16_4_ = auVar190._16_4_ + 0.0;
    auVar224._20_4_ = auVar190._20_4_ + 0.0;
    auVar224._24_4_ = auVar190._24_4_ + 0.0;
    auVar224._28_4_ = 0;
    auVar101 = vsubps_avx(ZEXT1632(auVar135),auVar190);
    auVar194 = vpermps_avx2(_DAT_01fb7720,auVar101);
    auVar210 = ZEXT1632(auVar135);
    auVar10 = vpermps_avx2(_DAT_01fb7720,auVar210);
    auVar101 = vmaxps_avx(auVar210,auVar224);
    auVar91 = vmaxps_avx(auVar194,auVar10);
    auVar101 = vmaxps_avx(auVar101,auVar91);
    auVar91 = vrsqrtps_avx(ZEXT1632(auVar81));
    fVar198 = auVar91._0_4_;
    fVar200 = auVar91._4_4_;
    fVar285 = auVar91._8_4_;
    fVar286 = auVar91._12_4_;
    fVar157 = auVar91._16_4_;
    fVar254 = auVar91._20_4_;
    fVar75 = auVar91._24_4_;
    auVar15._4_4_ = fVar200 * fVar200 * fVar200 * auVar81._4_4_ * -0.5;
    auVar15._0_4_ = fVar198 * fVar198 * fVar198 * auVar81._0_4_ * -0.5;
    auVar15._8_4_ = fVar285 * fVar285 * fVar285 * auVar81._8_4_ * -0.5;
    auVar15._12_4_ = fVar286 * fVar286 * fVar286 * auVar81._12_4_ * -0.5;
    auVar15._16_4_ = fVar157 * fVar157 * fVar157 * -0.0;
    auVar15._20_4_ = fVar254 * fVar254 * fVar254 * -0.0;
    auVar15._24_4_ = fVar75 * fVar75 * fVar75 * -0.0;
    auVar15._28_4_ = auVar10._28_4_;
    auVar191._8_4_ = 0x3fc00000;
    auVar191._0_8_ = 0x3fc000003fc00000;
    auVar191._12_4_ = 0x3fc00000;
    auVar191._16_4_ = 0x3fc00000;
    auVar191._20_4_ = 0x3fc00000;
    auVar191._24_4_ = 0x3fc00000;
    auVar191._28_4_ = 0x3fc00000;
    auVar239 = vfmadd231ps_fma(auVar15,auVar191,auVar91);
    fVar198 = auVar239._0_4_;
    fVar200 = auVar239._4_4_;
    auVar16._4_4_ = fVar111 * fVar200;
    auVar16._0_4_ = fVar110 * fVar198;
    fVar285 = auVar239._8_4_;
    auVar16._8_4_ = fVar113 * fVar285;
    fVar286 = auVar239._12_4_;
    auVar16._12_4_ = fVar236 * fVar286;
    auVar16._16_4_ = fVar248 * 0.0;
    auVar16._20_4_ = fVar249 * 0.0;
    uVar74 = auVar91._28_4_;
    auVar16._24_4_ = fVar251 * 0.0;
    auVar16._28_4_ = uVar74;
    auVar211._0_4_ = (float)local_8e0._0_4_ * fVar107 * fVar198;
    auVar211._4_4_ = (float)local_8e0._4_4_ * fVar109 * fVar200;
    auVar211._8_4_ = fStack_8d8 * fVar112 * fVar285;
    auVar211._12_4_ = fStack_8d4 * fVar134 * fVar286;
    auVar211._16_4_ = fStack_8d0 * fVar154 * 0.0;
    auVar211._20_4_ = fStack_8cc * fVar155 * 0.0;
    auVar211._24_4_ = fStack_8c8 * fVar156 * 0.0;
    auVar211._28_4_ = 0;
    auVar135 = vfmadd231ps_fma(auVar211,auVar16,_local_900);
    local_9a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar121);
    fVar110 = local_9a0._0_4_;
    fVar111 = local_9a0._4_4_;
    auVar17._4_4_ = fVar111 * fVar109 * fVar200;
    auVar17._0_4_ = fVar110 * fVar107 * fVar198;
    fVar113 = local_9a0._8_4_;
    auVar17._8_4_ = fVar113 * fVar112 * fVar285;
    fVar112 = local_9a0._12_4_;
    auVar17._12_4_ = fVar112 * fVar134 * fVar286;
    fVar134 = local_9a0._16_4_;
    auVar17._16_4_ = fVar134 * fVar154 * 0.0;
    fVar154 = local_9a0._20_4_;
    auVar17._20_4_ = fVar154 * fVar155 * 0.0;
    fVar155 = local_9a0._24_4_;
    auVar17._24_4_ = fVar155 * fVar156 * 0.0;
    auVar17._28_4_ = 0x3fc00000;
    local_2e0 = ZEXT1632(auVar77);
    auVar152 = vsubps_avx(ZEXT832(0) << 0x20,local_2e0);
    auVar227 = ZEXT3264(auVar152);
    auVar77 = vfmadd231ps_fma(auVar17,auVar152,auVar16);
    auVar18._4_4_ = fVar200 * fVar199;
    auVar18._0_4_ = fVar198 * fVar179;
    auVar18._8_4_ = fVar285 * fVar250;
    auVar18._12_4_ = fVar286 * fVar252;
    auVar18._16_4_ = fVar228 * 0.0;
    auVar18._20_4_ = fVar229 * 0.0;
    auVar18._24_4_ = fVar230 * 0.0;
    auVar18._28_4_ = uVar74;
    auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar18,_local_a00);
    auVar279 = ZEXT832(0) << 0x20;
    auVar9 = vsubps_avx(auVar279,auVar93);
    auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar9,auVar18);
    auVar91 = vsqrtps_avx(auVar90);
    auVar19._4_4_ = (float)local_8e0._4_4_ * fVar111;
    auVar19._0_4_ = (float)local_8e0._0_4_ * fVar110;
    auVar19._8_4_ = fStack_8d8 * fVar113;
    auVar19._12_4_ = fStack_8d4 * fVar112;
    auVar19._16_4_ = fStack_8d0 * fVar134;
    auVar19._20_4_ = fStack_8cc * fVar154;
    auVar19._24_4_ = fStack_8c8 * fVar155;
    auVar19._28_4_ = uVar74;
    auVar115 = vfmadd231ps_fma(auVar19,_local_900,auVar152);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),_local_a00,auVar9);
    fVar179 = auVar77._0_4_;
    fVar228 = auVar135._0_4_;
    fVar199 = auVar77._4_4_;
    fVar229 = auVar135._4_4_;
    fVar250 = auVar77._8_4_;
    fVar230 = auVar135._8_4_;
    fVar252 = auVar77._12_4_;
    fVar157 = auVar135._12_4_;
    auVar20._28_4_ = auVar90._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar157 * fVar252,
                            CONCAT48(fVar230 * fVar250,CONCAT44(fVar229 * fVar199,fVar228 * fVar179)
                                    )));
    auVar123 = vsubps_avx(ZEXT1632(auVar115),auVar20);
    auVar21._4_4_ = fVar111 * fVar111;
    auVar21._0_4_ = fVar110 * fVar110;
    auVar21._8_4_ = fVar113 * fVar113;
    auVar21._12_4_ = fVar112 * fVar112;
    auVar21._16_4_ = fVar134 * fVar134;
    auVar21._20_4_ = fVar154 * fVar154;
    auVar21._24_4_ = fVar155 * fVar155;
    auVar21._28_4_ = auVar90._28_4_;
    auVar115 = vfmadd231ps_fma(auVar21,auVar152,auVar152);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar9,auVar9);
    auVar195 = vsubps_avx(ZEXT1632(auVar115),
                          ZEXT1632(CONCAT412(fVar252 * fVar252,
                                             CONCAT48(fVar250 * fVar250,
                                                      CONCAT44(fVar199 * fVar199,fVar179 * fVar179))
                                            )));
    fVar109 = auVar101._28_4_ + auVar91._28_4_;
    fVar179 = (auVar101._0_4_ + auVar91._0_4_) * 1.0000002;
    fVar199 = (auVar101._4_4_ + auVar91._4_4_) * 1.0000002;
    fVar250 = (auVar101._8_4_ + auVar91._8_4_) * 1.0000002;
    fVar252 = (auVar101._12_4_ + auVar91._12_4_) * 1.0000002;
    fVar254 = (auVar101._16_4_ + auVar91._16_4_) * 1.0000002;
    fVar75 = (auVar101._20_4_ + auVar91._20_4_) * 1.0000002;
    fVar107 = (auVar101._24_4_ + auVar91._24_4_) * 1.0000002;
    auVar22._4_4_ = fVar199 * fVar199;
    auVar22._0_4_ = fVar179 * fVar179;
    auVar22._8_4_ = fVar250 * fVar250;
    auVar22._12_4_ = fVar252 * fVar252;
    auVar22._16_4_ = fVar254 * fVar254;
    auVar22._20_4_ = fVar75 * fVar75;
    auVar22._24_4_ = fVar107 * fVar107;
    auVar22._28_4_ = fVar109;
    local_aa0._0_4_ = auVar123._0_4_ + auVar123._0_4_;
    local_aa0._4_4_ = auVar123._4_4_ + auVar123._4_4_;
    local_aa0._8_4_ = auVar123._8_4_ + auVar123._8_4_;
    local_aa0._12_4_ = auVar123._12_4_ + auVar123._12_4_;
    local_aa0._16_4_ = auVar123._16_4_ + auVar123._16_4_;
    local_aa0._20_4_ = auVar123._20_4_ + auVar123._20_4_;
    local_aa0._24_4_ = auVar123._24_4_ + auVar123._24_4_;
    fVar179 = auVar123._28_4_;
    local_aa0._28_4_ = fVar179 + fVar179;
    auVar101 = vsubps_avx(auVar195,auVar22);
    auVar262 = ZEXT3264(auVar101);
    local_380 = ZEXT1632(auVar135);
    local_400._28_4_ = local_900._28_4_;
    local_400._0_28_ =
         ZEXT1628(CONCAT412(fVar157 * fVar157,
                            CONCAT48(fVar230 * fVar230,CONCAT44(fVar229 * fVar229,fVar228 * fVar228)
                                    )));
    auVar269 = ZEXT3264(local_400);
    local_940 = vsubps_avx(local_260,local_400);
    local_2a0._4_4_ = local_aa0._4_4_ * local_aa0._4_4_;
    local_2a0._0_4_ = local_aa0._0_4_ * local_aa0._0_4_;
    local_2a0._8_4_ = local_aa0._8_4_ * local_aa0._8_4_;
    local_2a0._12_4_ = local_aa0._12_4_ * local_aa0._12_4_;
    local_2a0._16_4_ = local_aa0._16_4_ * local_aa0._16_4_;
    local_2a0._20_4_ = local_aa0._20_4_ * local_aa0._20_4_;
    local_2a0._24_4_ = local_aa0._24_4_ * local_aa0._24_4_;
    local_2a0._28_4_ = fVar109;
    fVar199 = local_940._0_4_;
    local_2c0 = fVar199 * 4.0;
    fVar250 = local_940._4_4_;
    fStack_2bc = fVar250 * 4.0;
    fVar252 = local_940._8_4_;
    fStack_2b8 = fVar252 * 4.0;
    fVar228 = local_940._12_4_;
    fStack_2b4 = fVar228 * 4.0;
    fVar229 = local_940._16_4_;
    fStack_2b0 = fVar229 * 4.0;
    fVar230 = local_940._20_4_;
    fStack_2ac = fVar230 * 4.0;
    fVar157 = local_940._24_4_;
    fStack_2a8 = fVar157 * 4.0;
    uStack_2a4 = 0x40800000;
    auVar23._4_4_ = auVar101._4_4_ * fStack_2bc;
    auVar23._0_4_ = auVar101._0_4_ * local_2c0;
    auVar23._8_4_ = auVar101._8_4_ * fStack_2b8;
    auVar23._12_4_ = auVar101._12_4_ * fStack_2b4;
    auVar23._16_4_ = auVar101._16_4_ * fStack_2b0;
    auVar23._20_4_ = auVar101._20_4_ * fStack_2ac;
    auVar23._24_4_ = auVar101._24_4_ * fStack_2a8;
    auVar23._28_4_ = fVar179;
    auVar123 = vsubps_avx(local_2a0,auVar23);
    auVar90 = vcmpps_avx(auVar123,auVar279,5);
    local_360._0_4_ = fVar199 + fVar199;
    local_360._4_4_ = fVar250 + fVar250;
    local_360._8_4_ = fVar252 + fVar252;
    local_360._12_4_ = fVar228 + fVar228;
    local_360._16_4_ = fVar229 + fVar229;
    local_360._20_4_ = fVar230 + fVar230;
    local_360._24_4_ = fVar157 + fVar157;
    local_360._28_4_ = local_940._28_4_ + local_940._28_4_;
    if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar90 >> 0x7f,0) == '\0') &&
          (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar90 >> 0xbf,0) == '\0') &&
        (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar90[0x1f]) {
      local_a80._8_4_ = 0x7f800000;
      local_a80._0_8_ = 0x7f8000007f800000;
      local_a80._12_4_ = 0x7f800000;
      local_a80._16_4_ = 0x7f800000;
      local_a80._20_4_ = 0x7f800000;
      local_a80._24_4_ = 0x7f800000;
      local_a80._28_4_ = 0x7f800000;
      auVar280._8_4_ = 0xff800000;
      auVar280._0_8_ = 0xff800000ff800000;
      auVar280._12_4_ = 0xff800000;
      auVar280._16_4_ = 0xff800000;
      auVar280._20_4_ = 0xff800000;
      auVar280._24_4_ = 0xff800000;
      auVar280._28_4_ = 0xff800000;
      auVar192 = local_940;
    }
    else {
      auVar226 = vsqrtps_avx(auVar123);
      auVar279 = vcmpps_avx(auVar123,auVar279,5);
      auVar123 = vrcpps_avx(local_360);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar95._16_4_ = 0x3f800000;
      auVar95._20_4_ = 0x3f800000;
      auVar95._24_4_ = 0x3f800000;
      auVar95._28_4_ = 0x3f800000;
      auVar135 = vfnmadd213ps_fma(auVar123,local_360,auVar95);
      auVar135 = vfmadd132ps_fma(ZEXT1632(auVar135),auVar123,auVar123);
      uVar67 = CONCAT44(local_aa0._4_4_,local_aa0._0_4_);
      auVar283._0_8_ = uVar67 ^ 0x8000000080000000;
      auVar283._8_4_ = -local_aa0._8_4_;
      auVar283._12_4_ = -local_aa0._12_4_;
      auVar283._16_4_ = -local_aa0._16_4_;
      auVar283._20_4_ = -local_aa0._20_4_;
      auVar283._24_4_ = -local_aa0._24_4_;
      auVar283._28_4_ = -local_aa0._28_4_;
      auVar123 = vsubps_avx(auVar283,auVar226);
      auVar24._4_4_ = auVar123._4_4_ * auVar135._4_4_;
      auVar24._0_4_ = auVar123._0_4_ * auVar135._0_4_;
      auVar24._8_4_ = auVar123._8_4_ * auVar135._8_4_;
      auVar24._12_4_ = auVar123._12_4_ * auVar135._12_4_;
      auVar24._16_4_ = auVar123._16_4_ * 0.0;
      auVar24._20_4_ = auVar123._20_4_ * 0.0;
      auVar24._24_4_ = auVar123._24_4_ * 0.0;
      auVar24._28_4_ = auVar123._28_4_;
      auVar123 = vsubps_avx(auVar226,local_aa0);
      auVar281._0_4_ = auVar123._0_4_ * auVar135._0_4_;
      auVar281._4_4_ = auVar123._4_4_ * auVar135._4_4_;
      auVar281._8_4_ = auVar123._8_4_ * auVar135._8_4_;
      auVar281._12_4_ = auVar123._12_4_ * auVar135._12_4_;
      auVar281._16_4_ = auVar123._16_4_ * 0.0;
      auVar281._20_4_ = auVar123._20_4_ * 0.0;
      auVar281._24_4_ = auVar123._24_4_ * 0.0;
      auVar281._28_4_ = 0;
      auVar192 = ZEXT1632(auVar77);
      auVar135 = vfmadd213ps_fma(local_380,auVar24,auVar192);
      local_3c0 = fVar198 * auVar135._0_4_;
      fStack_3bc = fVar200 * auVar135._4_4_;
      fStack_3b8 = fVar285 * auVar135._8_4_;
      fStack_3b4 = fVar286 * auVar135._12_4_;
      uStack_3b0 = 0;
      uStack_3ac = 0;
      uStack_3a8 = 0;
      uStack_3a4 = 0x80000000;
      auVar123 = vandps_avx(local_400,local_920);
      auVar123 = vmaxps_avx(local_7c0,auVar123);
      auVar25._4_4_ = auVar123._4_4_ * 1.9073486e-06;
      auVar25._0_4_ = auVar123._0_4_ * 1.9073486e-06;
      auVar25._8_4_ = auVar123._8_4_ * 1.9073486e-06;
      auVar25._12_4_ = auVar123._12_4_ * 1.9073486e-06;
      auVar25._16_4_ = auVar123._16_4_ * 1.9073486e-06;
      auVar25._20_4_ = auVar123._20_4_ * 1.9073486e-06;
      auVar25._24_4_ = auVar123._24_4_ * 1.9073486e-06;
      auVar25._28_4_ = auVar123._28_4_;
      auVar123 = vandps_avx(local_940,local_920);
      auVar123 = vcmpps_avx(auVar123,auVar25,1);
      auVar135 = vfmadd213ps_fma(local_380,auVar281,auVar192);
      auVar96._8_4_ = 0x7f800000;
      auVar96._0_8_ = 0x7f8000007f800000;
      auVar96._12_4_ = 0x7f800000;
      auVar96._16_4_ = 0x7f800000;
      auVar96._20_4_ = 0x7f800000;
      auVar96._24_4_ = 0x7f800000;
      auVar96._28_4_ = 0x7f800000;
      local_a80 = vblendvps_avx(auVar96,auVar24,auVar279);
      local_3e0 = fVar198 * auVar135._0_4_;
      fStack_3dc = fVar200 * auVar135._4_4_;
      fStack_3d8 = fVar285 * auVar135._8_4_;
      fStack_3d4 = fVar286 * auVar135._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      uStack_3c4 = 0x7f800000;
      auVar274._8_4_ = 0xff800000;
      auVar274._0_8_ = 0xff800000ff800000;
      auVar274._12_4_ = 0xff800000;
      auVar274._16_4_ = 0xff800000;
      auVar274._20_4_ = 0xff800000;
      auVar274._24_4_ = 0xff800000;
      auVar274._28_4_ = 0xff800000;
      auVar280 = vblendvps_avx(auVar274,auVar281,auVar279);
      auVar226 = auVar279 & auVar123;
      if ((((((((auVar226 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar226 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar226 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar226 >> 0x7f,0) != '\0') ||
            (auVar226 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar226 >> 0xbf,0) != '\0') ||
          (auVar226 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar226[0x1f] < '\0') {
        auVar90 = vandps_avx(auVar123,auVar279);
        auVar123 = vcmpps_avx(auVar101,_DAT_01f7b000,2);
        auVar262 = ZEXT3264(auVar123);
        auVar153._8_4_ = 0xff800000;
        auVar153._0_8_ = 0xff800000ff800000;
        auVar153._12_4_ = 0xff800000;
        auVar153._16_4_ = 0xff800000;
        auVar153._20_4_ = 0xff800000;
        auVar153._24_4_ = 0xff800000;
        auVar153._28_4_ = 0xff800000;
        auVar105._8_4_ = 0x7f800000;
        auVar105._0_8_ = 0x7f8000007f800000;
        auVar105._12_4_ = 0x7f800000;
        auVar105._16_4_ = 0x7f800000;
        auVar105._20_4_ = 0x7f800000;
        auVar105._24_4_ = 0x7f800000;
        auVar105._28_4_ = 0x7f800000;
        auVar101 = vblendvps_avx(auVar105,auVar153,auVar123);
        auVar135 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
        auVar226 = vpmovsxwd_avx2(auVar135);
        local_a80 = vblendvps_avx(local_a80,auVar101,auVar226);
        auVar101 = vblendvps_avx(auVar153,auVar105,auVar123);
        auVar280 = vblendvps_avx(auVar280,auVar101,auVar226);
        auVar246._0_8_ = auVar90._0_8_ ^ 0xffffffffffffffff;
        auVar246._8_4_ = auVar90._8_4_ ^ 0xffffffff;
        auVar246._12_4_ = auVar90._12_4_ ^ 0xffffffff;
        auVar246._16_4_ = auVar90._16_4_ ^ 0xffffffff;
        auVar246._20_4_ = auVar90._20_4_ ^ 0xffffffff;
        auVar246._24_4_ = auVar90._24_4_ ^ 0xffffffff;
        auVar246._28_4_ = auVar90._28_4_ ^ 0xffffffff;
        auVar90 = vorps_avx(auVar123,auVar246);
        auVar90 = vandps_avx(auVar90,auVar279);
      }
    }
    local_440 = ZEXT1632(auVar77);
    auVar273 = ZEXT3264(auVar192);
    auVar215 = ZEXT3264(ZEXT1632(auVar239));
    auVar247 = ZEXT3264(local_7a0);
    auVar101 = local_7a0 & auVar90;
    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar101 >> 0x7f,0) != '\0') ||
          (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar101 >> 0xbf,0) != '\0') ||
        (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar101[0x1f] < '\0') {
      local_420 = ZEXT1632(auVar239);
      auVar269 = ZEXT3264(auVar90);
      fVar179 = *(float *)(ray + k * 4 + 0x100) - (float)local_a30._0_4_;
      auVar173._4_4_ = fVar179;
      auVar173._0_4_ = fVar179;
      auVar173._8_4_ = fVar179;
      auVar173._12_4_ = fVar179;
      auVar173._16_4_ = fVar179;
      auVar173._20_4_ = fVar179;
      auVar173._24_4_ = fVar179;
      auVar173._28_4_ = fVar179;
      auVar279 = vminps_avx(auVar173,auVar280);
      auVar232._0_4_ = auVar266._0_4_ * fVar110;
      auVar232._4_4_ = auVar266._4_4_ * fVar111;
      auVar232._8_4_ = auVar266._8_4_ * fVar113;
      auVar232._12_4_ = auVar266._12_4_ * fVar112;
      auVar232._16_4_ = auVar266._16_4_ * fVar134;
      auVar232._20_4_ = auVar266._20_4_ * fVar154;
      auVar232._24_4_ = auVar266._24_4_ * fVar155;
      auVar232._28_4_ = 0;
      auVar239 = vfmadd213ps_fma(auVar152,local_980,auVar232);
      auVar56._4_4_ = fStack_39c;
      auVar56._0_4_ = local_3a0;
      auVar56._8_4_ = fStack_398;
      auVar56._12_4_ = fStack_394;
      auVar56._16_4_ = fStack_390;
      auVar56._20_4_ = fStack_38c;
      auVar56._24_4_ = fStack_388;
      auVar56._28_4_ = fStack_384;
      auVar123 = vmaxps_avx(auVar56,local_a80);
      auVar77 = vfmadd213ps_fma(auVar9,auVar242,ZEXT1632(auVar239));
      auVar225._0_4_ = auVar266._0_4_ * (float)local_8e0._0_4_;
      auVar225._4_4_ = auVar266._4_4_ * (float)local_8e0._4_4_;
      auVar225._8_4_ = auVar266._8_4_ * fStack_8d8;
      auVar225._12_4_ = auVar266._12_4_ * fStack_8d4;
      auVar225._16_4_ = auVar266._16_4_ * fStack_8d0;
      auVar225._20_4_ = auVar266._20_4_ * fStack_8cc;
      auVar225._24_4_ = auVar266._24_4_ * fStack_8c8;
      auVar225._28_4_ = 0;
      auVar239 = vfmadd231ps_fma(auVar225,_local_900,local_980);
      auVar135 = vfmadd231ps_fma(ZEXT1632(auVar239),_local_a00,auVar242);
      auVar273 = ZEXT3264(local_920);
      auVar101 = vandps_avx(local_920,ZEXT1632(auVar135));
      auVar97._8_4_ = 0x219392ef;
      auVar97._0_8_ = 0x219392ef219392ef;
      auVar97._12_4_ = 0x219392ef;
      auVar97._16_4_ = 0x219392ef;
      auVar97._20_4_ = 0x219392ef;
      auVar97._24_4_ = 0x219392ef;
      auVar97._28_4_ = 0x219392ef;
      auVar152 = vcmpps_avx(auVar101,auVar97,1);
      auVar101 = vrcpps_avx(ZEXT1632(auVar135));
      auVar201._8_4_ = 0x3f800000;
      auVar201._0_8_ = 0x3f8000003f800000;
      auVar212._12_4_ = 0x3f800000;
      auVar212._0_12_ = auVar201;
      auVar212._16_4_ = 0x3f800000;
      auVar212._20_4_ = 0x3f800000;
      auVar212._24_4_ = 0x3f800000;
      auVar212._28_4_ = 0x3f800000;
      auVar226 = ZEXT1632(auVar135);
      auVar239 = vfnmadd213ps_fma(auVar101,auVar226,auVar212);
      auVar239 = vfmadd132ps_fma(ZEXT1632(auVar239),auVar101,auVar101);
      auVar275._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
      auVar275._8_4_ = auVar135._8_4_ ^ 0x80000000;
      auVar275._12_4_ = auVar135._12_4_ ^ 0x80000000;
      auVar275._16_4_ = 0x80000000;
      auVar275._20_4_ = 0x80000000;
      auVar275._24_4_ = 0x80000000;
      auVar275._28_4_ = 0x80000000;
      auVar282._0_4_ = auVar239._0_4_ * -auVar77._0_4_;
      auVar282._4_4_ = auVar239._4_4_ * -auVar77._4_4_;
      auVar282._8_4_ = auVar239._8_4_ * -auVar77._8_4_;
      auVar282._12_4_ = auVar239._12_4_ * -auVar77._12_4_;
      auVar282._16_4_ = 0x80000000;
      auVar282._20_4_ = 0x80000000;
      auVar282._24_4_ = 0x80000000;
      auVar282._28_4_ = 0;
      auVar101 = vcmpps_avx(auVar226,auVar275,1);
      auVar101 = vorps_avx(auVar152,auVar101);
      auVar284._8_4_ = 0xff800000;
      auVar284._0_8_ = 0xff800000ff800000;
      auVar284._12_4_ = 0xff800000;
      auVar284._16_4_ = 0xff800000;
      auVar284._20_4_ = 0xff800000;
      auVar284._24_4_ = 0xff800000;
      auVar284._28_4_ = 0xff800000;
      auVar101 = vblendvps_avx(auVar282,auVar284,auVar101);
      auVar9 = vmaxps_avx(auVar123,auVar101);
      auVar101 = vcmpps_avx(auVar226,auVar275,6);
      auVar101 = vorps_avx(auVar152,auVar101);
      auVar98._8_4_ = 0x7f800000;
      auVar98._0_8_ = 0x7f8000007f800000;
      auVar98._12_4_ = 0x7f800000;
      auVar98._16_4_ = 0x7f800000;
      auVar98._20_4_ = 0x7f800000;
      auVar98._24_4_ = 0x7f800000;
      auVar98._28_4_ = 0x7f800000;
      auVar101 = vblendvps_avx(auVar282,auVar98,auVar101);
      auVar123 = vminps_avx(auVar279,auVar101);
      fVar179 = -local_ae0._0_4_;
      fVar199 = -local_ae0._4_4_;
      fVar250 = -local_ae0._8_4_;
      fVar252 = -local_ae0._12_4_;
      fVar228 = -local_ae0._16_4_;
      fVar229 = -local_ae0._20_4_;
      fVar230 = -local_ae0._24_4_;
      auVar233._0_8_ = local_b00._0_8_ ^ 0x8000000080000000;
      auVar233._8_4_ = -local_b00._8_4_;
      auVar233._12_4_ = -local_b00._12_4_;
      auVar233._16_4_ = -local_b00._16_4_;
      auVar233._20_4_ = -local_b00._20_4_;
      auVar233._24_4_ = -local_b00._24_4_;
      auVar233._28_4_ = local_b00._28_4_ ^ 0x80000000;
      auVar152 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar101 = vsubps_avx(auVar152,local_960);
      auVar152 = vsubps_avx(auVar152,auVar99);
      auVar26._4_4_ = auVar152._4_4_ * fVar199;
      auVar26._0_4_ = auVar152._0_4_ * fVar179;
      auVar26._8_4_ = auVar152._8_4_ * fVar250;
      auVar26._12_4_ = auVar152._12_4_ * fVar252;
      auVar26._16_4_ = auVar152._16_4_ * fVar228;
      auVar26._20_4_ = auVar152._20_4_ * fVar229;
      auVar26._24_4_ = auVar152._24_4_ * fVar230;
      auVar26._28_4_ = auVar152._28_4_;
      auVar239 = vfmadd231ps_fma(auVar26,auVar233,auVar101);
      uStack_c84 = auVar122._28_4_;
      auVar243._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
      auVar243._8_4_ = -auVar122._8_4_;
      auVar243._12_4_ = -auVar122._12_4_;
      auVar243._16_4_ = -auVar122._16_4_;
      auVar243._20_4_ = -auVar122._20_4_;
      auVar243._24_4_ = -auVar122._24_4_;
      auVar243._28_4_ = uStack_c84 ^ 0x80000000;
      auVar101 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar147);
      auVar77 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar243,auVar101);
      auVar27._4_4_ = (float)local_8e0._4_4_ * fVar199;
      auVar27._0_4_ = (float)local_8e0._0_4_ * fVar179;
      auVar27._8_4_ = fStack_8d8 * fVar250;
      auVar27._12_4_ = fStack_8d4 * fVar252;
      auVar27._16_4_ = fStack_8d0 * fVar228;
      auVar27._20_4_ = fStack_8cc * fVar229;
      auVar27._24_4_ = fStack_8c8 * fVar230;
      auVar27._28_4_ = local_ae0._28_4_ ^ 0x80000000;
      auVar239 = vfmadd231ps_fma(auVar27,_local_900,auVar233);
      auVar135 = vfmadd231ps_fma(ZEXT1632(auVar239),auVar243,_local_a00);
      auVar101 = vandps_avx(local_920,ZEXT1632(auVar135));
      auVar147 = vrcpps_avx(ZEXT1632(auVar135));
      auVar174._8_4_ = 0x219392ef;
      auVar174._0_8_ = 0x219392ef219392ef;
      auVar174._12_4_ = 0x219392ef;
      auVar174._16_4_ = 0x219392ef;
      auVar174._20_4_ = 0x219392ef;
      auVar174._24_4_ = 0x219392ef;
      auVar174._28_4_ = 0x219392ef;
      auVar152 = vcmpps_avx(auVar101,auVar174,1);
      auVar99 = ZEXT1632(auVar135);
      auVar239 = vfnmadd213ps_fma(auVar147,auVar99,auVar212);
      auVar239 = vfmadd132ps_fma(ZEXT1632(auVar239),auVar147,auVar147);
      auVar244._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
      auVar244._8_4_ = auVar135._8_4_ ^ 0x80000000;
      auVar244._12_4_ = auVar135._12_4_ ^ 0x80000000;
      auVar244._16_4_ = 0x80000000;
      auVar244._20_4_ = 0x80000000;
      auVar244._24_4_ = 0x80000000;
      auVar244._28_4_ = 0x80000000;
      auVar247 = ZEXT3264(auVar244);
      auVar28._4_4_ = auVar239._4_4_ * -auVar77._4_4_;
      auVar28._0_4_ = auVar239._0_4_ * -auVar77._0_4_;
      auVar28._8_4_ = auVar239._8_4_ * -auVar77._8_4_;
      auVar28._12_4_ = auVar239._12_4_ * -auVar77._12_4_;
      auVar28._16_4_ = 0x80000000;
      auVar28._20_4_ = 0x80000000;
      auVar28._24_4_ = 0x80000000;
      auVar28._28_4_ = 0x80000000;
      auVar101 = vcmpps_avx(auVar99,auVar244,1);
      auVar101 = vorps_avx(auVar152,auVar101);
      auVar101 = vblendvps_avx(auVar28,auVar284,auVar101);
      auVar9 = vmaxps_avx(auVar9,auVar101);
      auVar262 = ZEXT3264(auVar9);
      auVar101 = vcmpps_avx(auVar99,auVar244,6);
      auVar101 = vorps_avx(auVar152,auVar101);
      auVar213._8_4_ = 0x7f800000;
      auVar213._0_8_ = 0x7f8000007f800000;
      auVar213._12_4_ = 0x7f800000;
      auVar213._16_4_ = 0x7f800000;
      auVar213._20_4_ = 0x7f800000;
      auVar213._24_4_ = 0x7f800000;
      auVar213._28_4_ = 0x7f800000;
      auVar215 = ZEXT3264(auVar213);
      auVar101 = vblendvps_avx(auVar28,auVar213,auVar101);
      auVar90 = vandps_avx(auVar90,local_7a0);
      auVar227 = ZEXT3264(auVar90);
      local_460 = vminps_avx(auVar123,auVar101);
      auVar101 = vcmpps_avx(auVar9,local_460,2);
      auVar152 = auVar90 & auVar101;
      if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar152 >> 0x7f,0) != '\0') ||
            (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar152 >> 0xbf,0) != '\0') ||
          (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar152[0x1f] < '\0') {
        auVar193 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x100));
        auVar55._4_4_ = fStack_3bc;
        auVar55._0_4_ = local_3c0;
        auVar55._8_4_ = fStack_3b8;
        auVar55._12_4_ = fStack_3b4;
        auVar55._16_4_ = uStack_3b0;
        auVar55._20_4_ = uStack_3ac;
        auVar55._24_4_ = uStack_3a8;
        auVar55._28_4_ = uStack_3a4;
        auVar152 = vminps_avx(auVar55,auVar212);
        auVar147 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar152 = vmaxps_avx(auVar152,ZEXT832(0) << 0x20);
        auVar54._4_4_ = fStack_3dc;
        auVar54._0_4_ = local_3e0;
        auVar54._8_4_ = fStack_3d8;
        auVar54._12_4_ = fStack_3d4;
        auVar54._16_4_ = uStack_3d0;
        auVar54._20_4_ = uStack_3cc;
        auVar54._24_4_ = uStack_3c8;
        auVar54._28_4_ = uStack_3c4;
        auVar123 = vminps_avx(auVar54,auVar212);
        auVar123 = vmaxps_avx(auVar123,ZEXT832(0) << 0x20);
        auVar29._4_4_ = (auVar152._4_4_ + 1.0) * 0.125;
        auVar29._0_4_ = (auVar152._0_4_ + 0.0) * 0.125;
        auVar29._8_4_ = (auVar152._8_4_ + 2.0) * 0.125;
        auVar29._12_4_ = (auVar152._12_4_ + 3.0) * 0.125;
        auVar29._16_4_ = (auVar152._16_4_ + 4.0) * 0.125;
        auVar29._20_4_ = (auVar152._20_4_ + 5.0) * 0.125;
        auVar29._24_4_ = (auVar152._24_4_ + 6.0) * 0.125;
        auVar29._28_4_ = auVar152._28_4_ + 7.0;
        auVar239 = vfmadd213ps_fma(auVar29,auVar92,local_9c0);
        auVar30._4_4_ = (auVar123._4_4_ + 1.0) * 0.125;
        auVar30._0_4_ = (auVar123._0_4_ + 0.0) * 0.125;
        auVar30._8_4_ = (auVar123._8_4_ + 2.0) * 0.125;
        auVar30._12_4_ = (auVar123._12_4_ + 3.0) * 0.125;
        auVar30._16_4_ = (auVar123._16_4_ + 4.0) * 0.125;
        auVar30._20_4_ = (auVar123._20_4_ + 5.0) * 0.125;
        auVar30._24_4_ = (auVar123._24_4_ + 6.0) * 0.125;
        auVar30._28_4_ = auVar123._28_4_ + 7.0;
        auVar77 = vfmadd213ps_fma(auVar30,auVar92,local_9c0);
        auVar152 = vminps_avx(auVar210,auVar224);
        auVar123 = vminps_avx(auVar194,auVar10);
        auVar152 = vminps_avx(auVar152,auVar123);
        auVar91 = vsubps_avx(auVar152,auVar91);
        auVar90 = vandps_avx(auVar101,auVar90);
        auVar215 = ZEXT3264(auVar90);
        local_1a0 = ZEXT1632(auVar239);
        local_1c0 = ZEXT1632(auVar77);
        auVar31._4_4_ = auVar91._4_4_ * 0.99999976;
        auVar31._0_4_ = auVar91._0_4_ * 0.99999976;
        auVar31._8_4_ = auVar91._8_4_ * 0.99999976;
        auVar31._12_4_ = auVar91._12_4_ * 0.99999976;
        auVar31._16_4_ = auVar91._16_4_ * 0.99999976;
        auVar31._20_4_ = auVar91._20_4_ * 0.99999976;
        auVar31._24_4_ = auVar91._24_4_ * 0.99999976;
        auVar31._28_4_ = 0x3f7ffffc;
        auVar91 = vmaxps_avx(ZEXT832(0) << 0x20,auVar31);
        auVar32._4_4_ = auVar91._4_4_ * auVar91._4_4_;
        auVar32._0_4_ = auVar91._0_4_ * auVar91._0_4_;
        auVar32._8_4_ = auVar91._8_4_ * auVar91._8_4_;
        auVar32._12_4_ = auVar91._12_4_ * auVar91._12_4_;
        auVar32._16_4_ = auVar91._16_4_ * auVar91._16_4_;
        auVar32._20_4_ = auVar91._20_4_ * auVar91._20_4_;
        auVar32._24_4_ = auVar91._24_4_ * auVar91._24_4_;
        auVar32._28_4_ = auVar91._28_4_;
        auVar91 = vsubps_avx(auVar195,auVar32);
        auVar33._4_4_ = auVar91._4_4_ * fStack_2bc;
        auVar33._0_4_ = auVar91._0_4_ * local_2c0;
        auVar33._8_4_ = auVar91._8_4_ * fStack_2b8;
        auVar33._12_4_ = auVar91._12_4_ * fStack_2b4;
        auVar33._16_4_ = auVar91._16_4_ * fStack_2b0;
        auVar33._20_4_ = auVar91._20_4_ * fStack_2ac;
        auVar33._24_4_ = auVar91._24_4_ * fStack_2a8;
        auVar33._28_4_ = auVar101._28_4_;
        auVar152 = vsubps_avx(local_2a0,auVar33);
        auVar101 = vcmpps_avx(auVar152,ZEXT832(0) << 0x20,5);
        auVar262 = ZEXT3264(auVar101);
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0x7f,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0xbf,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar101[0x1f]) {
          auVar194 = ZEXT1232(ZEXT812(0));
          auVar273 = ZEXT864(0) << 0x20;
          auVar99 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar122 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_d60 = ZEXT828(auVar201._4_8_ ^ 0x3f8000003f800000) << 0x20;
          auVar247 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar267._8_4_ = 0xff800000;
          auVar267._0_8_ = 0xff800000ff800000;
          auVar267._12_4_ = 0xff800000;
          auVar267._16_4_ = 0xff800000;
          auVar267._20_4_ = 0xff800000;
          auVar267._24_4_ = 0xff800000;
          auVar267._28_4_ = 0xff800000;
        }
        else {
          auVar123 = vrcpps_avx(local_360);
          auVar239 = vfnmadd213ps_fma(local_360,auVar123,auVar212);
          auVar239 = vfmadd132ps_fma(ZEXT1632(auVar239),auVar123,auVar123);
          auVar123 = vsqrtps_avx(auVar152);
          uVar67 = CONCAT44(local_aa0._4_4_,local_aa0._0_4_);
          auVar234._0_8_ = uVar67 ^ 0x8000000080000000;
          auVar234._8_4_ = -local_aa0._8_4_;
          auVar234._12_4_ = -local_aa0._12_4_;
          auVar234._16_4_ = -local_aa0._16_4_;
          auVar234._20_4_ = -local_aa0._20_4_;
          auVar234._24_4_ = -local_aa0._24_4_;
          auVar234._28_4_ = -local_aa0._28_4_;
          auVar195 = vsubps_avx(auVar234,auVar123);
          auVar123 = vsubps_avx(auVar123,local_aa0);
          fVar179 = auVar195._0_4_ * auVar239._0_4_;
          fVar199 = auVar195._4_4_ * auVar239._4_4_;
          auVar34._4_4_ = fVar199;
          auVar34._0_4_ = fVar179;
          fVar250 = auVar195._8_4_ * auVar239._8_4_;
          auVar34._8_4_ = fVar250;
          fVar252 = auVar195._12_4_ * auVar239._12_4_;
          auVar34._12_4_ = fVar252;
          fVar228 = auVar195._16_4_ * 0.0;
          auVar34._16_4_ = fVar228;
          fVar229 = auVar195._20_4_ * 0.0;
          auVar34._20_4_ = fVar229;
          fVar230 = auVar195._24_4_ * 0.0;
          auVar34._24_4_ = fVar230;
          auVar34._28_4_ = auVar195._28_4_;
          auVar276._0_4_ = auVar123._0_4_ * auVar239._0_4_;
          auVar276._4_4_ = auVar123._4_4_ * auVar239._4_4_;
          auVar276._8_4_ = auVar123._8_4_ * auVar239._8_4_;
          auVar276._12_4_ = auVar123._12_4_ * auVar239._12_4_;
          auVar276._16_4_ = auVar123._16_4_ * 0.0;
          auVar276._20_4_ = auVar123._20_4_ * 0.0;
          auVar276._24_4_ = auVar123._24_4_ * 0.0;
          auVar276._28_4_ = 0;
          auVar239 = vfmadd213ps_fma(local_380,auVar34,local_440);
          auVar77 = vfmadd213ps_fma(local_380,auVar276,local_440);
          auVar195 = ZEXT1632(CONCAT412(fVar286 * auVar239._12_4_,
                                        CONCAT48(fVar285 * auVar239._8_4_,
                                                 CONCAT44(fVar200 * auVar239._4_4_,
                                                          fVar198 * auVar239._0_4_))));
          auVar123 = ZEXT1632(CONCAT412(fVar286 * auVar77._12_4_,
                                        CONCAT48(fVar285 * auVar77._8_4_,
                                                 CONCAT44(fVar200 * auVar77._4_4_,
                                                          fVar198 * auVar77._0_4_))));
          auVar239 = vfmadd213ps_fma(local_320,auVar195,auVar93);
          auVar77 = vfmadd213ps_fma(local_320,auVar123,auVar93);
          auVar135 = vfmadd213ps_fma(local_340,auVar195,local_2e0);
          auVar115 = vfmadd213ps_fma(local_340,auVar123,local_2e0);
          auVar81 = vfmadd213ps_fma(auVar195,local_300,auVar121);
          auVar116 = vfmadd213ps_fma(local_300,auVar123,auVar121);
          auVar35._4_4_ = fVar199 * (float)local_a00._4_4_;
          auVar35._0_4_ = fVar179 * (float)local_a00._0_4_;
          auVar35._8_4_ = fVar250 * fStack_9f8;
          auVar35._12_4_ = fVar252 * fStack_9f4;
          auVar35._16_4_ = fVar228 * fStack_9f0;
          auVar35._20_4_ = fVar229 * fStack_9ec;
          auVar35._24_4_ = fVar230 * fStack_9e8;
          auVar35._28_4_ = 0;
          auVar99 = vsubps_avx(auVar35,ZEXT1632(auVar239));
          auVar36._4_4_ = (float)local_900._4_4_ * fVar199;
          auVar36._0_4_ = (float)local_900._0_4_ * fVar179;
          auVar36._8_4_ = fStack_8f8 * fVar250;
          auVar36._12_4_ = fStack_8f4 * fVar252;
          auVar36._16_4_ = fStack_8f0 * fVar228;
          auVar36._20_4_ = fStack_8ec * fVar229;
          auVar36._24_4_ = fStack_8e8 * fVar230;
          auVar36._28_4_ = 0;
          auVar122 = vsubps_avx(auVar36,ZEXT1632(auVar135));
          auVar148._0_4_ = (float)local_8e0._0_4_ * fVar179;
          auVar148._4_4_ = (float)local_8e0._4_4_ * fVar199;
          auVar148._8_4_ = fStack_8d8 * fVar250;
          auVar148._12_4_ = fStack_8d4 * fVar252;
          auVar148._16_4_ = fStack_8d0 * fVar228;
          auVar148._20_4_ = fStack_8cc * fVar229;
          auVar148._24_4_ = fStack_8c8 * fVar230;
          auVar148._28_4_ = 0;
          auVar123 = vsubps_avx(auVar148,ZEXT1632(auVar81));
          _local_d60 = auVar123._0_28_;
          auVar196._0_4_ = auVar276._0_4_ * (float)local_a00._0_4_;
          auVar196._4_4_ = auVar276._4_4_ * (float)local_a00._4_4_;
          auVar196._8_4_ = auVar276._8_4_ * fStack_9f8;
          auVar196._12_4_ = auVar276._12_4_ * fStack_9f4;
          auVar196._16_4_ = auVar276._16_4_ * fStack_9f0;
          auVar196._20_4_ = auVar276._20_4_ * fStack_9ec;
          auVar196._24_4_ = auVar276._24_4_ * fStack_9e8;
          auVar196._28_4_ = 0;
          auVar147 = vsubps_avx(auVar196,ZEXT1632(auVar77));
          auVar37._4_4_ = (float)local_900._4_4_ * auVar276._4_4_;
          auVar37._0_4_ = (float)local_900._0_4_ * auVar276._0_4_;
          auVar37._8_4_ = fStack_8f8 * auVar276._8_4_;
          auVar37._12_4_ = fStack_8f4 * auVar276._12_4_;
          auVar37._16_4_ = fStack_8f0 * auVar276._16_4_;
          auVar37._20_4_ = fStack_8ec * auVar276._20_4_;
          auVar37._24_4_ = fStack_8e8 * auVar276._24_4_;
          auVar37._28_4_ = 0;
          auVar194 = vsubps_avx(auVar37,ZEXT1632(auVar115));
          auVar38._4_4_ = (float)local_8e0._4_4_ * auVar276._4_4_;
          auVar38._0_4_ = (float)local_8e0._0_4_ * auVar276._0_4_;
          auVar38._8_4_ = fStack_8d8 * auVar276._8_4_;
          auVar38._12_4_ = fStack_8d4 * auVar276._12_4_;
          auVar38._16_4_ = fStack_8d0 * auVar276._16_4_;
          auVar38._20_4_ = fStack_8cc * auVar276._20_4_;
          auVar38._24_4_ = fStack_8c8 * auVar276._24_4_;
          auVar38._28_4_ = local_900._28_4_;
          auVar123 = vsubps_avx(auVar38,ZEXT1632(auVar116));
          auVar273 = ZEXT3264(auVar123);
          auVar195 = vcmpps_avx(auVar152,_DAT_01f7b000,5);
          auVar245._8_4_ = 0x7f800000;
          auVar245._0_8_ = 0x7f8000007f800000;
          auVar245._12_4_ = 0x7f800000;
          auVar245._16_4_ = 0x7f800000;
          auVar245._20_4_ = 0x7f800000;
          auVar245._24_4_ = 0x7f800000;
          auVar245._28_4_ = 0x7f800000;
          auVar123 = vblendvps_avx(auVar245,auVar34,auVar195);
          auVar247 = ZEXT3264(auVar123);
          auVar152 = vandps_avx(local_920,local_400);
          auVar152 = vmaxps_avx(local_7c0,auVar152);
          auVar39._4_4_ = auVar152._4_4_ * 1.9073486e-06;
          auVar39._0_4_ = auVar152._0_4_ * 1.9073486e-06;
          auVar39._8_4_ = auVar152._8_4_ * 1.9073486e-06;
          auVar39._12_4_ = auVar152._12_4_ * 1.9073486e-06;
          auVar39._16_4_ = auVar152._16_4_ * 1.9073486e-06;
          auVar39._20_4_ = auVar152._20_4_ * 1.9073486e-06;
          auVar39._24_4_ = auVar152._24_4_ * 1.9073486e-06;
          auVar39._28_4_ = auVar152._28_4_;
          auVar152 = vandps_avx(local_920,local_940);
          auVar152 = vcmpps_avx(auVar152,auVar39,1);
          auVar268._8_4_ = 0xff800000;
          auVar268._0_8_ = 0xff800000ff800000;
          auVar268._12_4_ = 0xff800000;
          auVar268._16_4_ = 0xff800000;
          auVar268._20_4_ = 0xff800000;
          auVar268._24_4_ = 0xff800000;
          auVar268._28_4_ = 0xff800000;
          auVar267 = vblendvps_avx(auVar268,auVar276,auVar195);
          auVar10 = auVar195 & auVar152;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar10 >> 0x7f,0) == '\0') &&
                (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0xbf,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar10[0x1f]) {
            auVar262 = ZEXT3264(auVar101);
          }
          else {
            auVar101 = vandps_avx(auVar152,auVar195);
            auVar152 = vcmpps_avx(auVar91,_DAT_01f7b000,2);
            auVar178._8_4_ = 0xff800000;
            auVar178._0_8_ = 0xff800000ff800000;
            auVar178._12_4_ = 0xff800000;
            auVar178._16_4_ = 0xff800000;
            auVar178._20_4_ = 0xff800000;
            auVar178._24_4_ = 0xff800000;
            auVar178._28_4_ = 0xff800000;
            auVar261._8_4_ = 0x7f800000;
            auVar261._0_8_ = 0x7f8000007f800000;
            auVar261._12_4_ = 0x7f800000;
            auVar261._16_4_ = 0x7f800000;
            auVar261._20_4_ = 0x7f800000;
            auVar261._24_4_ = 0x7f800000;
            auVar261._28_4_ = 0x7f800000;
            auVar91 = vblendvps_avx(auVar261,auVar178,auVar152);
            auVar239 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
            auVar10 = vpmovsxwd_avx2(auVar239);
            auVar91 = vblendvps_avx(auVar123,auVar91,auVar10);
            auVar247 = ZEXT3264(auVar91);
            auVar91 = vblendvps_avx(auVar178,auVar261,auVar152);
            auVar267 = vblendvps_avx(auVar267,auVar91,auVar10);
            auVar235._0_8_ = auVar101._0_8_ ^ 0xffffffffffffffff;
            auVar235._8_4_ = auVar101._8_4_ ^ 0xffffffff;
            auVar235._12_4_ = auVar101._12_4_ ^ 0xffffffff;
            auVar235._16_4_ = auVar101._16_4_ ^ 0xffffffff;
            auVar235._20_4_ = auVar101._20_4_ ^ 0xffffffff;
            auVar235._24_4_ = auVar101._24_4_ ^ 0xffffffff;
            auVar235._28_4_ = auVar101._28_4_ ^ 0xffffffff;
            auVar101 = vorps_avx(auVar235,auVar152);
            auVar101 = vandps_avx(auVar195,auVar101);
            auVar262 = ZEXT3264(auVar101);
          }
        }
        local_5e0 = auVar9;
        local_5c0 = vminps_avx(local_460,auVar247._0_32_);
        _local_b20 = vmaxps_avx(auVar9,auVar267);
        _local_480 = _local_b20;
        auVar101 = vcmpps_avx(auVar9,local_5c0,2);
        local_860 = vandps_avx(auVar101,auVar90);
        auVar269 = ZEXT3264(local_860);
        auVar101 = vcmpps_avx(_local_b20,local_460,2);
        auVar90 = vandps_avx(auVar101,auVar90);
        auVar101 = vorps_avx(auVar90,local_860);
        auVar227 = ZEXT3264(_local_8e0);
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar101 >> 0x7f,0) != '\0') ||
              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar101 >> 0xbf,0) != '\0') ||
            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar101[0x1f] < '\0') {
          auVar40._4_4_ = auVar273._4_4_ * (float)local_8e0._4_4_;
          auVar40._0_4_ = auVar273._0_4_ * (float)local_8e0._0_4_;
          auVar40._8_4_ = auVar273._8_4_ * fStack_8d8;
          auVar40._12_4_ = auVar273._12_4_ * fStack_8d4;
          auVar40._16_4_ = auVar273._16_4_ * fStack_8d0;
          auVar40._20_4_ = auVar273._20_4_ * fStack_8cc;
          auVar40._24_4_ = auVar273._24_4_ * fStack_8c8;
          auVar40._28_4_ = auVar101._28_4_;
          auVar247 = ZEXT3264(_local_8e0);
          auVar239 = vfmadd213ps_fma(auVar194,_local_900,auVar40);
          auVar227 = ZEXT3264(_local_a00);
          auVar239 = vfmadd213ps_fma(auVar147,_local_a00,ZEXT1632(auVar239));
          auVar176._0_8_ = auVar262._0_8_ ^ 0xffffffffffffffff;
          auVar176._8_4_ = auVar262._8_4_ ^ 0xffffffff;
          auVar176._12_4_ = auVar262._12_4_ ^ 0xffffffff;
          auVar176._16_4_ = auVar262._16_4_ ^ 0xffffffff;
          auVar176._20_4_ = auVar262._20_4_ ^ 0xffffffff;
          auVar176._24_4_ = auVar262._24_4_ ^ 0xffffffff;
          auVar176._28_4_ = auVar262._28_4_ ^ 0xffffffff;
          auVar262 = ZEXT3264(local_920);
          auVar101 = vandps_avx(local_920,ZEXT1632(auVar239));
          auVar214._8_4_ = 0x3e99999a;
          auVar214._0_8_ = 0x3e99999a3e99999a;
          auVar214._12_4_ = 0x3e99999a;
          auVar214._16_4_ = 0x3e99999a;
          auVar214._20_4_ = 0x3e99999a;
          auVar214._24_4_ = 0x3e99999a;
          auVar214._28_4_ = 0x3e99999a;
          auVar215 = ZEXT3264(auVar214);
          auVar101 = vcmpps_avx(auVar101,auVar214,1);
          local_8a0 = vorps_avx(auVar101,auVar176);
          auVar150._0_4_ = (float)local_8e0._0_4_ * (float)local_d60._0_4_;
          auVar150._4_4_ = (float)local_8e0._4_4_ * (float)local_d60._4_4_;
          auVar150._8_4_ = fStack_8d8 * fStack_d58;
          auVar150._12_4_ = fStack_8d4 * fStack_d54;
          auVar150._16_4_ = fStack_8d0 * fStack_d50;
          auVar150._20_4_ = fStack_8cc * fStack_d4c;
          auVar150._24_4_ = fStack_8c8 * fStack_d48;
          auVar150._28_4_ = 0;
          auVar239 = vfmadd213ps_fma(auVar122,_local_900,auVar150);
          auVar239 = vfmadd213ps_fma(auVar99,_local_a00,ZEXT1632(auVar239));
          auVar101 = vandps_avx(local_920,ZEXT1632(auVar239));
          auVar101 = vcmpps_avx(auVar101,auVar214,1);
          auVar101 = vorps_avx(auVar101,auVar176);
          auVar125._8_4_ = 3;
          auVar125._0_8_ = 0x300000003;
          auVar125._12_4_ = 3;
          auVar125._16_4_ = 3;
          auVar125._20_4_ = 3;
          auVar125._24_4_ = 3;
          auVar125._28_4_ = 3;
          auVar151._8_4_ = 2;
          auVar151._0_8_ = 0x200000002;
          auVar151._12_4_ = 2;
          auVar151._16_4_ = 2;
          auVar151._20_4_ = 2;
          auVar151._24_4_ = 2;
          auVar151._28_4_ = 2;
          auVar101 = vblendvps_avx(auVar151,auVar125,auVar101);
          local_8c0._4_4_ = local_d6c;
          local_8c0._0_4_ = local_d6c;
          local_8c0._8_4_ = local_d6c;
          local_8c0._12_4_ = local_d6c;
          local_8c0._16_4_ = local_d6c;
          local_8c0._20_4_ = local_d6c;
          local_8c0._24_4_ = local_d6c;
          local_8c0._28_4_ = local_d6c;
          local_880 = vpcmpgtd_avx2(auVar101,local_8c0);
          local_600 = vpandn_avx2(local_880,local_860);
          local_9e0._4_4_ = auVar9._4_4_ + fVar106;
          local_9e0._0_4_ = auVar9._0_4_ + fVar106;
          fStack_9d8 = auVar9._8_4_ + fVar106;
          fStack_9d4 = auVar9._12_4_ + fVar106;
          fStack_9d0 = auVar9._16_4_ + fVar106;
          fStack_9cc = auVar9._20_4_ + fVar106;
          fStack_9c8 = auVar9._24_4_ + fVar106;
          fStack_9c4 = auVar9._28_4_ + fVar106;
          fVar179 = (float)local_b20._0_4_;
          fVar198 = (float)local_b20._4_4_;
          fVar199 = fStack_b18;
          fVar200 = fStack_b14;
          fVar250 = fStack_b10;
          fVar285 = fStack_b0c;
          fVar252 = fStack_b08;
          fVar286 = fStack_b04;
          while( true ) {
            auVar101 = _local_480;
            fStack_c3c = auVar7._4_4_;
            fStack_c38 = auVar7._8_4_;
            fStack_c34 = auVar7._12_4_;
            if ((((((((local_600 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_600 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_600 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_600 >> 0x7f,0) == '\0') &&
                  (local_600 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_600 >> 0xbf,0) == '\0') &&
                (local_600 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_600[0x1f]) break;
            auVar126._8_4_ = 0x7f800000;
            auVar126._0_8_ = 0x7f8000007f800000;
            auVar126._12_4_ = 0x7f800000;
            auVar126._16_4_ = 0x7f800000;
            auVar126._20_4_ = 0x7f800000;
            auVar126._24_4_ = 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar101 = vblendvps_avx(auVar126,auVar9,local_600);
            auVar91 = vshufps_avx(auVar101,auVar101,0xb1);
            auVar91 = vminps_avx(auVar101,auVar91);
            auVar152 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar152);
            auVar152 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar152);
            auVar91 = vcmpps_avx(auVar101,auVar91,0);
            auVar152 = local_600 & auVar91;
            auVar101 = local_600;
            if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar152 >> 0x7f,0) != '\0') ||
                  (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar152 >> 0xbf,0) != '\0') ||
                (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar152[0x1f] < '\0') {
              auVar101 = vandps_avx(auVar91,local_600);
            }
            uVar64 = vmovmskps_avx(auVar101);
            iVar63 = 0;
            for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar63 = iVar63 + 1;
            }
            uVar67 = (ulong)(uint)(iVar63 << 2);
            *(undefined4 *)(local_600 + uVar67) = 0;
            uVar64 = *(uint *)(local_1a0 + uVar67);
            uVar68 = *(uint *)(local_5e0 + uVar67);
            fVar179 = auVar4._0_4_;
            if ((float)local_ac0._0_4_ < 0.0) {
              auVar262 = ZEXT1664(auVar262._0_16_);
              auVar269 = ZEXT1664(auVar269._0_16_);
              auVar273 = ZEXT1664(auVar273._0_16_);
              fVar179 = sqrtf((float)local_ac0._0_4_);
              uVar67 = extraout_RAX;
            }
            auVar227 = ZEXT464(uVar68);
            auVar77 = vminps_avx(auVar8,auVar78);
            auVar239 = vmaxps_avx(auVar8,auVar78);
            auVar215 = ZEXT1664(auVar7);
            auVar135 = vminps_avx(auVar6,auVar7);
            auVar115 = vminps_avx(auVar77,auVar135);
            auVar77 = vmaxps_avx(auVar6,auVar7);
            auVar135 = vmaxps_avx(auVar239,auVar77);
            auVar239 = vandps_avx(auVar115,auVar231);
            auVar77 = vandps_avx(auVar135,auVar231);
            auVar239 = vmaxps_avx(auVar239,auVar77);
            auVar77 = vmovshdup_avx(auVar239);
            auVar77 = vmaxss_avx(auVar77,auVar239);
            auVar239 = vshufpd_avx(auVar239,auVar239,1);
            auVar239 = vmaxss_avx(auVar239,auVar77);
            fVar198 = auVar239._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar179 * 1.9073486e-06;
            local_9c0._0_16_ = vshufps_avx(auVar135,auVar135,0xff);
            auVar239 = vinsertps_avx(ZEXT416(uVar68),ZEXT416(uVar64),0x10);
            auVar247 = ZEXT1664(auVar239);
            uVar70 = 0;
            while( true ) {
              auVar239 = auVar247._0_16_;
              bVar62 = (byte)uVar67;
              if (uVar70 == 5) break;
              auVar135 = vmovshdup_avx(auVar239);
              fVar252 = auVar135._0_4_;
              fVar285 = 1.0 - fVar252;
              fVar250 = fVar285 * fVar285 * fVar285;
              fVar200 = fVar252 * fVar252 * fVar252;
              auVar115 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar250),
                                         ZEXT416((uint)fVar200));
              fVar179 = fVar252 * fVar285;
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * fVar179 * 6.0)),
                                        ZEXT416((uint)(fVar285 * fVar179)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar285 * fVar179 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar252 * fVar179)));
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar200),
                                        ZEXT416((uint)fVar250));
              fVar199 = (auVar77._0_4_ + auVar116._0_4_) * 0.16666667;
              fVar200 = fVar200 * 0.16666667;
              auVar117._0_4_ = fVar200 * fVar108;
              auVar117._4_4_ = fVar200 * fStack_c3c;
              auVar117._8_4_ = fVar200 * fStack_c38;
              auVar117._12_4_ = fVar200 * fStack_c34;
              auVar158._4_4_ = fVar199;
              auVar158._0_4_ = fVar199;
              auVar158._8_4_ = fVar199;
              auVar158._12_4_ = fVar199;
              auVar77 = vfmadd132ps_fma(auVar158,auVar117,auVar6);
              fVar199 = (auVar115._0_4_ + auVar81._0_4_) * 0.16666667;
              auVar118._4_4_ = fVar199;
              auVar118._0_4_ = fVar199;
              auVar118._8_4_ = fVar199;
              auVar118._12_4_ = fVar199;
              auVar77 = vfmadd132ps_fma(auVar118,auVar77,auVar78);
              fVar199 = auVar247._0_4_;
              auVar136._4_4_ = fVar199;
              auVar136._0_4_ = fVar199;
              auVar136._8_4_ = fVar199;
              auVar136._12_4_ = fVar199;
              auVar115 = vfmadd213ps_fma(auVar136,local_ab0,_DAT_01f45a50);
              fVar250 = fVar250 * 0.16666667;
              auVar80._4_4_ = fVar250;
              auVar80._0_4_ = fVar250;
              auVar80._8_4_ = fVar250;
              auVar80._12_4_ = fVar250;
              auVar77 = vfmadd132ps_fma(auVar80,auVar77,auVar8);
              local_960._0_16_ = auVar77;
              auVar115 = vsubps_avx(auVar115,auVar77);
              auVar77 = vdpps_avx(auVar115,auVar115,0x7f);
              fVar228 = auVar77._0_4_;
              if (fVar228 < 0.0) {
                auVar215._0_4_ = sqrtf(fVar228);
                auVar215._4_60_ = extraout_var;
                auVar81 = auVar215._0_16_;
                uVar67 = extraout_RAX_00;
              }
              else {
                auVar81 = vsqrtss_avx(auVar77,auVar77);
              }
              auVar76 = ZEXT416((uint)fVar285);
              auVar82._4_4_ = fVar285;
              auVar82._0_4_ = fVar285;
              auVar82._8_4_ = fVar285;
              auVar82._12_4_ = fVar285;
              auVar139 = vfnmsub213ss_fma(auVar135,auVar135,ZEXT416((uint)(fVar179 * 4.0)));
              auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * 4.0)),auVar76,auVar76);
              fVar179 = fVar285 * -fVar285 * 0.5;
              fVar200 = auVar139._0_4_ * 0.5;
              fVar250 = auVar116._0_4_ * 0.5;
              fVar285 = fVar252 * fVar252 * 0.5;
              auVar206._0_4_ = fVar108 * fVar285;
              auVar206._4_4_ = fStack_c3c * fVar285;
              auVar206._8_4_ = fStack_c38 * fVar285;
              auVar206._12_4_ = fStack_c34 * fVar285;
              auVar159._4_4_ = fVar250;
              auVar159._0_4_ = fVar250;
              auVar159._8_4_ = fVar250;
              auVar159._12_4_ = fVar250;
              auVar116 = vfmadd213ps_fma(auVar159,auVar6,auVar206);
              auVar182._4_4_ = fVar200;
              auVar182._0_4_ = fVar200;
              auVar182._8_4_ = fVar200;
              auVar182._12_4_ = fVar200;
              auVar116 = vfmadd213ps_fma(auVar182,auVar78,auVar116);
              auVar259._4_4_ = fVar179;
              auVar259._0_4_ = fVar179;
              auVar259._8_4_ = fVar179;
              auVar259._12_4_ = fVar179;
              auVar181 = vfmadd213ps_fma(auVar259,auVar8,auVar116);
              auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar76,auVar135);
              auVar139 = vfmadd213ss_fma(auVar135,SUB6416(ZEXT464(0xc0000000),0),auVar76);
              auVar135 = vshufps_avx(auVar239,auVar239,0x55);
              auVar160._0_4_ = fVar108 * auVar135._0_4_;
              auVar160._4_4_ = fStack_c3c * auVar135._4_4_;
              auVar160._8_4_ = fStack_c38 * auVar135._8_4_;
              auVar160._12_4_ = fStack_c34 * auVar135._12_4_;
              uVar74 = auVar139._0_4_;
              auVar183._4_4_ = uVar74;
              auVar183._0_4_ = uVar74;
              auVar183._8_4_ = uVar74;
              auVar183._12_4_ = uVar74;
              auVar135 = vfmadd213ps_fma(auVar183,auVar6,auVar160);
              auVar137._0_4_ = auVar116._0_4_;
              auVar137._4_4_ = auVar137._0_4_;
              auVar137._8_4_ = auVar137._0_4_;
              auVar137._12_4_ = auVar137._0_4_;
              auVar135 = vfmadd213ps_fma(auVar137,auVar78,auVar135);
              auVar76 = vfmadd231ps_fma(auVar135,auVar8,auVar82);
              auVar116 = vdpps_avx(auVar181,auVar181,0x7f);
              auVar135 = vblendps_avx(auVar116,_DAT_01f45a50,0xe);
              auVar139 = vrsqrtss_avx(auVar135,auVar135);
              fVar179 = auVar139._0_4_;
              fVar250 = auVar116._0_4_;
              fVar179 = fVar179 * 1.5 + fVar250 * -0.5 * fVar179 * fVar179 * fVar179;
              auVar139 = vdpps_avx(auVar181,auVar76,0x7f);
              auVar138._0_4_ = auVar76._0_4_ * fVar250;
              auVar138._4_4_ = auVar76._4_4_ * fVar250;
              auVar138._8_4_ = auVar76._8_4_ * fVar250;
              auVar138._12_4_ = auVar76._12_4_ * fVar250;
              fVar200 = auVar139._0_4_;
              auVar207._0_4_ = auVar181._0_4_ * fVar200;
              auVar207._4_4_ = auVar181._4_4_ * fVar200;
              fVar285 = auVar181._8_4_;
              auVar207._8_4_ = fVar285 * fVar200;
              fVar252 = auVar181._12_4_;
              auVar207._12_4_ = fVar252 * fVar200;
              auVar139 = vsubps_avx(auVar138,auVar207);
              auVar135 = vrcpss_avx(auVar135,auVar135);
              auVar76 = vfnmadd213ss_fma(auVar135,auVar116,ZEXT416(0x40000000));
              fVar200 = auVar135._0_4_ * auVar76._0_4_;
              auVar135 = vmaxss_avx(ZEXT416((uint)fVar198),
                                    ZEXT416((uint)(fVar199 * (float)local_980._0_4_)));
              auVar133 = ZEXT1664(auVar135);
              auVar240._0_8_ = auVar181._0_8_ ^ 0x8000000080000000;
              auVar240._8_4_ = -fVar285;
              auVar240._12_4_ = -fVar252;
              auVar161._0_4_ = fVar179 * auVar139._0_4_ * fVar200;
              auVar161._4_4_ = fVar179 * auVar139._4_4_ * fVar200;
              auVar161._8_4_ = fVar179 * auVar139._8_4_ * fVar200;
              auVar161._12_4_ = fVar179 * auVar139._12_4_ * fVar200;
              auVar271._0_4_ = auVar181._0_4_ * fVar179;
              auVar271._4_4_ = auVar181._4_4_ * fVar179;
              auVar271._8_4_ = fVar285 * fVar179;
              auVar271._12_4_ = fVar252 * fVar179;
              if (fVar250 < -fVar250) {
                local_ae0._0_16_ = auVar271;
                local_b00._0_16_ = auVar161;
                fVar179 = sqrtf(fVar250);
                auVar133 = ZEXT464(auVar135._0_4_);
                auVar81 = ZEXT416(auVar81._0_4_);
                uVar67 = extraout_RAX_01;
                auVar161 = local_b00._0_16_;
                auVar271 = local_ae0._0_16_;
              }
              else {
                auVar116 = vsqrtss_avx(auVar116,auVar116);
                fVar179 = auVar116._0_4_;
              }
              auVar116 = vdpps_avx(auVar115,auVar271,0x7f);
              auVar180 = vfmadd213ss_fma(ZEXT416((uint)fVar198),auVar81,auVar133._0_16_);
              auVar139 = vdpps_avx(auVar240,auVar271,0x7f);
              auVar76 = vdpps_avx(auVar115,auVar161,0x7f);
              auVar114 = vdpps_avx(local_ab0,auVar271,0x7f);
              auVar180 = vfmadd213ss_fma(ZEXT416((uint)(auVar81._0_4_ + 1.0)),
                                         ZEXT416((uint)(fVar198 / fVar179)),auVar180);
              auVar269 = ZEXT1664(auVar180);
              fVar179 = auVar139._0_4_ + auVar76._0_4_;
              auVar273 = ZEXT464((uint)fVar179);
              fVar200 = auVar116._0_4_;
              auVar83._0_4_ = fVar200 * fVar200;
              auVar83._4_4_ = auVar116._4_4_ * auVar116._4_4_;
              auVar83._8_4_ = auVar116._8_4_ * auVar116._8_4_;
              auVar83._12_4_ = auVar116._12_4_ * auVar116._12_4_;
              auVar81 = vdpps_avx(auVar115,auVar240,0x7f);
              auVar76 = vsubps_avx(auVar77,auVar83);
              auVar139 = vrsqrtss_avx(auVar76,auVar76);
              fVar250 = auVar76._0_4_;
              fVar199 = auVar139._0_4_;
              fVar199 = fVar199 * 1.5 + fVar250 * -0.5 * fVar199 * fVar199 * fVar199;
              auVar139 = vdpps_avx(auVar115,local_ab0,0x7f);
              auVar81 = vfnmadd231ss_fma(auVar81,auVar116,ZEXT416((uint)fVar179));
              auVar139 = vfnmadd231ss_fma(auVar139,auVar116,auVar114);
              if (fVar250 < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar179);
                local_b00._0_16_ = auVar114;
                local_9a0._0_16_ = auVar81;
                local_a80._0_4_ = fVar199;
                local_aa0._0_16_ = auVar139;
                fVar179 = sqrtf(fVar250);
                auVar273 = ZEXT1664(local_ae0._0_16_);
                auVar269 = ZEXT464(auVar180._0_4_);
                auVar133 = ZEXT464(auVar135._0_4_);
                uVar67 = extraout_RAX_02;
                fVar199 = (float)local_a80._0_4_;
                auVar139 = local_aa0._0_16_;
                auVar114 = local_b00._0_16_;
                auVar81 = local_9a0._0_16_;
              }
              else {
                auVar135 = vsqrtss_avx(auVar76,auVar76);
                fVar179 = auVar135._0_4_;
              }
              auVar227 = ZEXT1664(auVar77);
              auVar262 = ZEXT1664(auVar181);
              auVar135 = vpermilps_avx(local_960._0_16_,0xff);
              fVar179 = fVar179 - auVar135._0_4_;
              auVar76 = vshufps_avx(auVar181,auVar181,0xff);
              auVar135 = vfmsub213ss_fma(auVar81,ZEXT416((uint)fVar199),auVar76);
              auVar162._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
              auVar162._8_4_ = auVar114._8_4_ ^ 0x80000000;
              auVar162._12_4_ = auVar114._12_4_ ^ 0x80000000;
              auVar184._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
              auVar184._8_4_ = auVar135._8_4_ ^ 0x80000000;
              auVar184._12_4_ = auVar135._12_4_ ^ 0x80000000;
              auVar139 = ZEXT416((uint)(auVar139._0_4_ * fVar199));
              auVar180 = auVar273._0_16_;
              auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar114._0_4_ * auVar135._0_4_)),auVar180,
                                        auVar139);
              auVar215 = ZEXT1664(auVar81);
              auVar135 = vinsertps_avx(auVar184,auVar139,0x1c);
              uVar74 = auVar81._0_4_;
              auVar185._4_4_ = uVar74;
              auVar185._0_4_ = uVar74;
              auVar185._8_4_ = uVar74;
              auVar185._12_4_ = uVar74;
              auVar135 = vdivps_avx(auVar135,auVar185);
              auVar81 = vinsertps_avx(auVar180,auVar162,0x10);
              auVar81 = vdivps_avx(auVar81,auVar185);
              auVar140._0_4_ = fVar200 * auVar135._0_4_ + fVar179 * auVar81._0_4_;
              auVar140._4_4_ = fVar200 * auVar135._4_4_ + fVar179 * auVar81._4_4_;
              auVar140._8_4_ = fVar200 * auVar135._8_4_ + fVar179 * auVar81._8_4_;
              auVar140._12_4_ = fVar200 * auVar135._12_4_ + fVar179 * auVar81._12_4_;
              auVar135 = vsubps_avx(auVar239,auVar140);
              auVar247 = ZEXT1664(auVar135);
              auVar239 = vandps_avx(auVar116,auVar231);
              if (auVar239._0_4_ < auVar269._0_4_) {
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar269._0_4_ + auVar133._0_4_)),
                                          local_9c0._0_16_,ZEXT416(0x36000000));
                auVar239 = vandps_avx(ZEXT416((uint)fVar179),auVar231);
                if (auVar239._0_4_ < auVar81._0_4_) {
                  bVar72 = uVar70 < 5;
                  fVar229 = auVar135._0_4_ + (float)local_a30._0_4_;
                  if (fVar229 < fVar73) {
                    bVar62 = 0;
                    goto LAB_0111ebff;
                  }
                  fVar230 = *(float *)(ray + k * 4 + 0x100);
                  fVar179 = (float)local_b20._0_4_;
                  fVar198 = (float)local_b20._4_4_;
                  fVar199 = fStack_b18;
                  fVar200 = fStack_b14;
                  fVar250 = fStack_b10;
                  fVar285 = fStack_b0c;
                  fVar252 = fStack_b08;
                  fVar286 = fStack_b04;
                  if (fVar229 <= fVar230) {
                    auVar239 = vmovshdup_avx(auVar135);
                    bVar62 = 0;
                    if ((0.0 <= auVar239._0_4_) && (bVar62 = 0, auVar239._0_4_ <= 1.0)) {
                      auVar81 = vrsqrtss_avx(auVar77,auVar77);
                      fVar157 = auVar81._0_4_;
                      auVar215 = ZEXT464((uint)(fVar228 * -0.5));
                      pGVar2 = (context->scene->geometries).items[uVar69].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar62 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_0111ed01;
                        fVar228 = fVar157 * 1.5 + fVar228 * -0.5 * fVar157 * fVar157 * fVar157;
                        local_b80 = auVar115._0_4_;
                        fStack_b7c = auVar115._4_4_;
                        fStack_b78 = auVar115._8_4_;
                        fStack_b74 = auVar115._12_4_;
                        auVar163._0_4_ = fVar228 * local_b80;
                        auVar163._4_4_ = fVar228 * fStack_b7c;
                        auVar163._8_4_ = fVar228 * fStack_b78;
                        auVar163._12_4_ = fVar228 * fStack_b74;
                        auVar139 = vfmadd213ps_fma(auVar76,auVar163,auVar181);
                        auVar115 = vshufps_avx(auVar163,auVar163,0xc9);
                        auVar81 = vshufps_avx(auVar181,auVar181,0xc9);
                        auVar164._0_4_ = auVar163._0_4_ * auVar81._0_4_;
                        auVar164._4_4_ = auVar163._4_4_ * auVar81._4_4_;
                        auVar164._8_4_ = auVar163._8_4_ * auVar81._8_4_;
                        auVar164._12_4_ = auVar163._12_4_ * auVar81._12_4_;
                        auVar116 = vfmsub231ps_fma(auVar164,auVar181,auVar115);
                        auVar115 = vshufps_avx(auVar116,auVar116,0xc9);
                        auVar81 = vshufps_avx(auVar139,auVar139,0xc9);
                        auVar215 = ZEXT1664(auVar81);
                        auVar116 = vshufps_avx(auVar116,auVar116,0xd2);
                        auVar84._0_4_ = auVar139._0_4_ * auVar116._0_4_;
                        auVar84._4_4_ = auVar139._4_4_ * auVar116._4_4_;
                        auVar84._8_4_ = auVar139._8_4_ * auVar116._8_4_;
                        auVar84._12_4_ = auVar139._12_4_ * auVar116._12_4_;
                        auVar115 = vfmsub231ps_fma(auVar84,auVar115,auVar81);
                        local_540 = auVar239._0_8_;
                        auVar239 = vmovshdup_avx(auVar115);
                        local_5a0._8_8_ = auVar239._0_8_;
                        auVar239 = vshufps_avx(auVar115,auVar115,0xaa);
                        local_580 = auVar239._0_8_;
                        local_560 = auVar115._0_4_;
                        local_5a0._0_8_ = local_5a0._8_8_;
                        local_5a0._16_8_ = local_5a0._8_8_;
                        local_5a0._24_8_ = local_5a0._8_8_;
                        uStack_578 = local_580;
                        uStack_570 = local_580;
                        uStack_568 = local_580;
                        uStack_55c = local_560;
                        uStack_558 = local_560;
                        uStack_554 = local_560;
                        uStack_550 = local_560;
                        uStack_54c = local_560;
                        uStack_548 = local_560;
                        uStack_544 = local_560;
                        uStack_538 = local_540;
                        uStack_530 = local_540;
                        uStack_528 = local_540;
                        auVar141._12_4_ = 0;
                        auVar141._0_12_ = ZEXT812(0);
                        auVar141 = auVar141 << 0x20;
                        local_520 = ZEXT1232(ZEXT812(0)) << 0x20;
                        local_500 = CONCAT44(uStack_7fc,local_800);
                        uStack_4f8 = CONCAT44(uStack_7f4,uStack_7f8);
                        uStack_4f0 = CONCAT44(uStack_7ec,uStack_7f0);
                        uStack_4e8 = CONCAT44(uStack_7e4,uStack_7e8);
                        local_4e0._4_4_ = uStack_7dc;
                        local_4e0._0_4_ = local_7e0;
                        local_4e0._8_4_ = uStack_7d8;
                        local_4e0._12_4_ = uStack_7d4;
                        local_4e0._16_4_ = uStack_7d0;
                        local_4e0._20_4_ = uStack_7cc;
                        local_4e0._24_4_ = uStack_7c8;
                        local_4e0._28_4_ = uStack_7c4;
                        vpcmpeqd_avx2(local_4e0,local_4e0);
                        local_4c0 = context->user->instID[0];
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        uStack_4b0 = local_4c0;
                        uStack_4ac = local_4c0;
                        uStack_4a8 = local_4c0;
                        uStack_4a4 = local_4c0;
                        local_4a0 = context->user->instPrimID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        *(float *)(ray + k * 4 + 0x100) = fVar229;
                        local_a60 = local_820;
                        local_b50.valid = (int *)local_a60;
                        local_b50.geometryUserPtr = pGVar2->userPtr;
                        local_b50.context = context->user;
                        local_b50.hit = (RTCHitN *)local_5a0;
                        local_b50.N = 8;
                        local_b50.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar215 = ZEXT1664(auVar81);
                          auVar227 = ZEXT1664(auVar77);
                          auVar247 = ZEXT1664(auVar135);
                          auVar262 = ZEXT1664(auVar181);
                          auVar273 = ZEXT1664(auVar180);
                          (*pGVar2->occlusionFilterN)(&local_b50);
                          auVar141 = ZEXT816(0) << 0x40;
                          fVar179 = (float)local_b20._0_4_;
                          fVar198 = (float)local_b20._4_4_;
                          fVar199 = fStack_b18;
                          fVar200 = fStack_b14;
                          fVar250 = fStack_b10;
                          fVar285 = fStack_b0c;
                          fVar252 = fStack_b08;
                          fVar286 = fStack_b04;
                        }
                        auVar91 = ZEXT1632(auVar141);
                        auVar101 = vpcmpeqd_avx2(local_a60,auVar91);
                        auVar101 = _DAT_01f7b020 & ~auVar101;
                        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar101 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar101 >> 0x7f,0) != '\0')
                              || (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar101 >> 0xbf,0) != '\0') ||
                            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar101[0x1f] < '\0') {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar215 = ZEXT1664(auVar215._0_16_);
                            auVar227 = ZEXT1664(auVar227._0_16_);
                            auVar247 = ZEXT1664(auVar247._0_16_);
                            auVar262 = ZEXT1664(auVar262._0_16_);
                            auVar273 = ZEXT1664(auVar273._0_16_);
                            (*p_Var3)(&local_b50);
                            auVar91 = ZEXT832(0) << 0x40;
                            fVar179 = (float)local_b20._0_4_;
                            fVar198 = (float)local_b20._4_4_;
                            fVar199 = fStack_b18;
                            fVar200 = fStack_b14;
                            fVar250 = fStack_b10;
                            fVar285 = fStack_b0c;
                            fVar252 = fStack_b08;
                            fVar286 = fStack_b04;
                          }
                          auVar91 = vpcmpeqd_avx2(local_a60,auVar91);
                          auVar127._8_4_ = 0xff800000;
                          auVar127._0_8_ = 0xff800000ff800000;
                          auVar127._12_4_ = 0xff800000;
                          auVar127._16_4_ = 0xff800000;
                          auVar127._20_4_ = 0xff800000;
                          auVar127._24_4_ = 0xff800000;
                          auVar127._28_4_ = 0xff800000;
                          auVar101 = vblendvps_avx(auVar127,*(undefined1 (*) [32])
                                                             (local_b50.ray + 0x100),auVar91);
                          *(undefined1 (*) [32])(local_b50.ray + 0x100) = auVar101;
                          auVar101 = _DAT_01f7b020 & ~auVar91;
                          if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar101 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar101 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar101 >> 0x7f,0) != '\0') ||
                                (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar101 >> 0xbf,0) != '\0') ||
                              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar101[0x1f] < '\0') {
                            bVar62 = 1;
                            goto LAB_0111ed01;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar230;
                      }
                      goto LAB_0111ec8e;
                    }
                  }
                  else {
LAB_0111ec8e:
                    bVar62 = 0;
                  }
LAB_0111ed01:
                  auVar269 = ZEXT464((uint)fVar230);
                  goto LAB_0111ec1a;
                }
              }
              uVar70 = uVar70 + 1;
            }
            bVar72 = false;
LAB_0111ebff:
            fVar179 = (float)local_b20._0_4_;
            fVar198 = (float)local_b20._4_4_;
            fVar199 = fStack_b18;
            fVar200 = fStack_b14;
            fVar250 = fStack_b10;
            fVar285 = fStack_b0c;
            fVar252 = fStack_b08;
            fVar286 = fStack_b04;
LAB_0111ec1a:
            uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar193._4_4_ = uVar74;
            auVar193._0_4_ = uVar74;
            auVar193._8_4_ = uVar74;
            auVar193._12_4_ = uVar74;
            auVar193._16_4_ = uVar74;
            auVar193._20_4_ = uVar74;
            auVar193._24_4_ = uVar74;
            auVar193._28_4_ = uVar74;
            bVar71 = bVar71 | bVar72 & bVar62;
            auVar101 = vcmpps_avx(_local_9e0,auVar193,2);
            local_600 = vandps_avx(auVar101,local_600);
          }
          auVar103._0_4_ = fVar179 + fVar106;
          auVar103._4_4_ = fVar198 + fVar106;
          auVar103._8_4_ = fVar199 + fVar106;
          auVar103._12_4_ = fVar200 + fVar106;
          auVar103._16_4_ = fVar250 + fVar106;
          auVar103._20_4_ = fVar285 + fVar106;
          auVar103._24_4_ = fVar252 + fVar106;
          auVar103._28_4_ = fVar286 + fVar106;
          uVar74 = auVar193._0_4_;
          auVar128._4_4_ = uVar74;
          auVar128._0_4_ = uVar74;
          auVar128._8_4_ = uVar74;
          auVar128._12_4_ = uVar74;
          auVar128._16_4_ = uVar74;
          auVar128._20_4_ = uVar74;
          auVar128._24_4_ = uVar74;
          auVar128._28_4_ = uVar74;
          auVar91 = vcmpps_avx(auVar103,auVar128,2);
          auVar90 = vandps_avx(auVar91,auVar90);
          auVar104._8_4_ = 3;
          auVar104._0_8_ = 0x300000003;
          auVar104._12_4_ = 3;
          auVar104._16_4_ = 3;
          auVar104._20_4_ = 3;
          auVar104._24_4_ = 3;
          auVar104._28_4_ = 3;
          auVar129._8_4_ = 2;
          auVar129._0_8_ = 0x200000002;
          auVar129._12_4_ = 2;
          auVar129._16_4_ = 2;
          auVar129._20_4_ = 2;
          auVar129._24_4_ = 2;
          auVar129._28_4_ = 2;
          auVar91 = vblendvps_avx(auVar129,auVar104,local_8a0);
          _local_9e0 = vpcmpgtd_avx2(auVar91,local_8c0);
          local_620 = vpandn_avx2(_local_9e0,auVar90);
          local_b20._4_4_ = fVar106 + (float)local_480._4_4_;
          local_b20._0_4_ = fVar106 + (float)local_480._0_4_;
          fStack_b18 = fVar106 + fStack_478;
          fStack_b14 = fVar106 + fStack_474;
          fStack_b10 = fVar106 + fStack_470;
          fStack_b0c = fVar106 + fStack_46c;
          fStack_b08 = fVar106 + fStack_468;
          fStack_b04 = fVar106 + fStack_464;
          for (; (((((((local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_620 >> 0x7f,0) != '\0') ||
                   (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_620 >> 0xbf,0) != '\0') ||
                 (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_620[0x1f] < '\0'; local_620 = vandps_avx(auVar91,local_620)) {
            auVar130._8_4_ = 0x7f800000;
            auVar130._0_8_ = 0x7f8000007f800000;
            auVar130._12_4_ = 0x7f800000;
            auVar130._16_4_ = 0x7f800000;
            auVar130._20_4_ = 0x7f800000;
            auVar130._24_4_ = 0x7f800000;
            auVar130._28_4_ = 0x7f800000;
            auVar91 = vblendvps_avx(auVar130,auVar101,local_620);
            auVar152 = vshufps_avx(auVar91,auVar91,0xb1);
            auVar152 = vminps_avx(auVar91,auVar152);
            auVar9 = vshufpd_avx(auVar152,auVar152,5);
            auVar152 = vminps_avx(auVar152,auVar9);
            auVar9 = vpermpd_avx2(auVar152,0x4e);
            auVar152 = vminps_avx(auVar152,auVar9);
            auVar152 = vcmpps_avx(auVar91,auVar152,0);
            auVar9 = local_620 & auVar152;
            auVar91 = local_620;
            if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0x7f,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar9 >> 0xbf,0) != '\0') ||
                (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar9[0x1f] < '\0') {
              auVar91 = vandps_avx(auVar152,local_620);
            }
            uVar64 = vmovmskps_avx(auVar91);
            iVar63 = 0;
            for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar63 = iVar63 + 1;
            }
            uVar67 = (ulong)(uint)(iVar63 << 2);
            *(undefined4 *)(local_620 + uVar67) = 0;
            uVar64 = *(uint *)(local_1c0 + uVar67);
            uVar68 = *(uint *)(local_460 + uVar67);
            fVar179 = auVar5._0_4_;
            if ((float)local_ac0._0_4_ < 0.0) {
              auVar262 = ZEXT1664(auVar262._0_16_);
              auVar269 = ZEXT1664(auVar269._0_16_);
              auVar273 = ZEXT1664(auVar273._0_16_);
              fVar179 = sqrtf((float)local_ac0._0_4_);
              uVar67 = extraout_RAX_03;
            }
            auVar227 = ZEXT464(uVar68);
            auVar77 = vminps_avx(auVar8,auVar78);
            auVar239 = vmaxps_avx(auVar8,auVar78);
            auVar215 = ZEXT1664(auVar7);
            auVar135 = vminps_avx(auVar6,auVar7);
            auVar115 = vminps_avx(auVar77,auVar135);
            auVar77 = vmaxps_avx(auVar6,auVar7);
            auVar135 = vmaxps_avx(auVar239,auVar77);
            auVar239 = vandps_avx(auVar115,auVar231);
            auVar77 = vandps_avx(auVar135,auVar231);
            auVar239 = vmaxps_avx(auVar239,auVar77);
            auVar77 = vmovshdup_avx(auVar239);
            auVar77 = vmaxss_avx(auVar77,auVar239);
            auVar239 = vshufpd_avx(auVar239,auVar239,1);
            auVar239 = vmaxss_avx(auVar239,auVar77);
            fVar198 = auVar239._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar179 * 1.9073486e-06;
            local_9c0._0_16_ = vshufps_avx(auVar135,auVar135,0xff);
            auVar239 = vinsertps_avx(ZEXT416(uVar68),ZEXT416(uVar64),0x10);
            auVar247 = ZEXT1664(auVar239);
            uVar70 = 0;
            while( true ) {
              auVar239 = auVar247._0_16_;
              bVar62 = (byte)uVar67;
              if (uVar70 == 5) break;
              auVar135 = vmovshdup_avx(auVar239);
              fVar252 = auVar135._0_4_;
              fVar285 = 1.0 - fVar252;
              fVar250 = fVar285 * fVar285 * fVar285;
              fVar200 = fVar252 * fVar252 * fVar252;
              auVar115 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar250),
                                         ZEXT416((uint)fVar200));
              fVar179 = fVar252 * fVar285;
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * fVar179 * 6.0)),
                                        ZEXT416((uint)(fVar285 * fVar179)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar285 * fVar179 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar252 * fVar179)));
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar200),
                                        ZEXT416((uint)fVar250));
              fVar199 = (auVar77._0_4_ + auVar116._0_4_) * 0.16666667;
              fVar200 = fVar200 * 0.16666667;
              auVar119._0_4_ = fVar200 * fVar108;
              auVar119._4_4_ = fVar200 * fStack_c3c;
              auVar119._8_4_ = fVar200 * fStack_c38;
              auVar119._12_4_ = fVar200 * fStack_c34;
              auVar165._4_4_ = fVar199;
              auVar165._0_4_ = fVar199;
              auVar165._8_4_ = fVar199;
              auVar165._12_4_ = fVar199;
              auVar77 = vfmadd132ps_fma(auVar165,auVar119,auVar6);
              fVar199 = (auVar115._0_4_ + auVar81._0_4_) * 0.16666667;
              auVar120._4_4_ = fVar199;
              auVar120._0_4_ = fVar199;
              auVar120._8_4_ = fVar199;
              auVar120._12_4_ = fVar199;
              auVar77 = vfmadd132ps_fma(auVar120,auVar77,auVar78);
              fVar200 = auVar247._0_4_;
              auVar142._4_4_ = fVar200;
              auVar142._0_4_ = fVar200;
              auVar142._8_4_ = fVar200;
              auVar142._12_4_ = fVar200;
              auVar115 = vfmadd213ps_fma(auVar142,local_ab0,_DAT_01f45a50);
              fVar250 = fVar250 * 0.16666667;
              auVar85._4_4_ = fVar250;
              auVar85._0_4_ = fVar250;
              auVar85._8_4_ = fVar250;
              auVar85._12_4_ = fVar250;
              auVar77 = vfmadd132ps_fma(auVar85,auVar77,auVar8);
              local_960._0_16_ = auVar77;
              auVar115 = vsubps_avx(auVar115,auVar77);
              auVar77 = vdpps_avx(auVar115,auVar115,0x7f);
              fVar199 = auVar77._0_4_;
              if (fVar199 < 0.0) {
                auVar133._0_4_ = sqrtf(fVar199);
                auVar133._4_60_ = extraout_var_00;
                auVar81 = auVar133._0_16_;
                uVar67 = extraout_RAX_04;
              }
              else {
                auVar81 = vsqrtss_avx(auVar77,auVar77);
              }
              auVar76 = ZEXT416((uint)fVar285);
              auVar86._4_4_ = fVar285;
              auVar86._0_4_ = fVar285;
              auVar86._8_4_ = fVar285;
              auVar86._12_4_ = fVar285;
              auVar139 = vfnmsub213ss_fma(auVar135,auVar135,ZEXT416((uint)(fVar179 * 4.0)));
              auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * 4.0)),auVar76,auVar76);
              fVar179 = fVar285 * -fVar285 * 0.5;
              fVar250 = auVar139._0_4_ * 0.5;
              fVar285 = auVar116._0_4_ * 0.5;
              fVar252 = fVar252 * fVar252 * 0.5;
              auVar208._0_4_ = fVar108 * fVar252;
              auVar208._4_4_ = fStack_c3c * fVar252;
              auVar208._8_4_ = fStack_c38 * fVar252;
              auVar208._12_4_ = fStack_c34 * fVar252;
              auVar166._4_4_ = fVar285;
              auVar166._0_4_ = fVar285;
              auVar166._8_4_ = fVar285;
              auVar166._12_4_ = fVar285;
              auVar116 = vfmadd213ps_fma(auVar166,auVar6,auVar208);
              auVar186._4_4_ = fVar250;
              auVar186._0_4_ = fVar250;
              auVar186._8_4_ = fVar250;
              auVar186._12_4_ = fVar250;
              auVar116 = vfmadd213ps_fma(auVar186,auVar78,auVar116);
              auVar260._4_4_ = fVar179;
              auVar260._0_4_ = fVar179;
              auVar260._8_4_ = fVar179;
              auVar260._12_4_ = fVar179;
              auVar181 = vfmadd213ps_fma(auVar260,auVar8,auVar116);
              auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar76,auVar135);
              auVar139 = vfmadd213ss_fma(auVar135,SUB6416(ZEXT464(0xc0000000),0),auVar76);
              auVar135 = vshufps_avx(auVar239,auVar239,0x55);
              auVar167._0_4_ = fVar108 * auVar135._0_4_;
              auVar167._4_4_ = fStack_c3c * auVar135._4_4_;
              auVar167._8_4_ = fStack_c38 * auVar135._8_4_;
              auVar167._12_4_ = fStack_c34 * auVar135._12_4_;
              uVar74 = auVar139._0_4_;
              auVar187._4_4_ = uVar74;
              auVar187._0_4_ = uVar74;
              auVar187._8_4_ = uVar74;
              auVar187._12_4_ = uVar74;
              auVar135 = vfmadd213ps_fma(auVar187,auVar6,auVar167);
              auVar143._0_4_ = auVar116._0_4_;
              auVar143._4_4_ = auVar143._0_4_;
              auVar143._8_4_ = auVar143._0_4_;
              auVar143._12_4_ = auVar143._0_4_;
              auVar135 = vfmadd213ps_fma(auVar143,auVar78,auVar135);
              auVar76 = vfmadd231ps_fma(auVar135,auVar8,auVar86);
              auVar116 = vdpps_avx(auVar181,auVar181,0x7f);
              auVar135 = vblendps_avx(auVar116,_DAT_01f45a50,0xe);
              auVar139 = vrsqrtss_avx(auVar135,auVar135);
              fVar179 = auVar139._0_4_;
              fVar285 = auVar116._0_4_;
              fVar179 = fVar179 * 1.5 + fVar285 * -0.5 * fVar179 * fVar179 * fVar179;
              auVar139 = vdpps_avx(auVar181,auVar76,0x7f);
              auVar144._0_4_ = auVar76._0_4_ * fVar285;
              auVar144._4_4_ = auVar76._4_4_ * fVar285;
              auVar144._8_4_ = auVar76._8_4_ * fVar285;
              auVar144._12_4_ = auVar76._12_4_ * fVar285;
              fVar250 = auVar139._0_4_;
              auVar209._0_4_ = auVar181._0_4_ * fVar250;
              auVar209._4_4_ = auVar181._4_4_ * fVar250;
              fVar252 = auVar181._8_4_;
              auVar209._8_4_ = fVar252 * fVar250;
              fVar286 = auVar181._12_4_;
              auVar209._12_4_ = fVar286 * fVar250;
              auVar139 = vsubps_avx(auVar144,auVar209);
              auVar135 = vrcpss_avx(auVar135,auVar135);
              auVar76 = vfnmadd213ss_fma(auVar135,auVar116,ZEXT416(0x40000000));
              fVar250 = auVar135._0_4_ * auVar76._0_4_;
              auVar135 = vmaxss_avx(ZEXT416((uint)fVar198),
                                    ZEXT416((uint)(fVar200 * (float)local_980._0_4_)));
              auVar133 = ZEXT1664(auVar135);
              auVar241._0_8_ = auVar181._0_8_ ^ 0x8000000080000000;
              auVar241._8_4_ = -fVar252;
              auVar241._12_4_ = -fVar286;
              auVar168._0_4_ = fVar179 * auVar139._0_4_ * fVar250;
              auVar168._4_4_ = fVar179 * auVar139._4_4_ * fVar250;
              auVar168._8_4_ = fVar179 * auVar139._8_4_ * fVar250;
              auVar168._12_4_ = fVar179 * auVar139._12_4_ * fVar250;
              auVar272._0_4_ = auVar181._0_4_ * fVar179;
              auVar272._4_4_ = auVar181._4_4_ * fVar179;
              auVar272._8_4_ = fVar252 * fVar179;
              auVar272._12_4_ = fVar286 * fVar179;
              if (fVar285 < -fVar285) {
                local_ae0._0_16_ = auVar272;
                local_b00._0_16_ = auVar168;
                fVar179 = sqrtf(fVar285);
                auVar133 = ZEXT464(auVar135._0_4_);
                auVar81 = ZEXT416(auVar81._0_4_);
                uVar67 = extraout_RAX_05;
                auVar168 = local_b00._0_16_;
                auVar272 = local_ae0._0_16_;
              }
              else {
                auVar116 = vsqrtss_avx(auVar116,auVar116);
                fVar179 = auVar116._0_4_;
              }
              auVar116 = vdpps_avx(auVar115,auVar272,0x7f);
              auVar180 = vfmadd213ss_fma(ZEXT416((uint)fVar198),auVar81,auVar133._0_16_);
              auVar139 = vdpps_avx(auVar241,auVar272,0x7f);
              auVar76 = vdpps_avx(auVar115,auVar168,0x7f);
              auVar114 = vdpps_avx(local_ab0,auVar272,0x7f);
              auVar180 = vfmadd213ss_fma(ZEXT416((uint)(auVar81._0_4_ + 1.0)),
                                         ZEXT416((uint)(fVar198 / fVar179)),auVar180);
              auVar269 = ZEXT1664(auVar180);
              fVar179 = auVar139._0_4_ + auVar76._0_4_;
              auVar273 = ZEXT464((uint)fVar179);
              fVar250 = auVar116._0_4_;
              auVar87._0_4_ = fVar250 * fVar250;
              auVar87._4_4_ = auVar116._4_4_ * auVar116._4_4_;
              auVar87._8_4_ = auVar116._8_4_ * auVar116._8_4_;
              auVar87._12_4_ = auVar116._12_4_ * auVar116._12_4_;
              auVar81 = vdpps_avx(auVar115,auVar241,0x7f);
              auVar76 = vsubps_avx(auVar77,auVar87);
              auVar139 = vrsqrtss_avx(auVar76,auVar76);
              fVar285 = auVar76._0_4_;
              fVar200 = auVar139._0_4_;
              fVar200 = fVar200 * 1.5 + fVar285 * -0.5 * fVar200 * fVar200 * fVar200;
              auVar139 = vdpps_avx(auVar115,local_ab0,0x7f);
              auVar81 = vfnmadd231ss_fma(auVar81,auVar116,ZEXT416((uint)fVar179));
              auVar139 = vfnmadd231ss_fma(auVar139,auVar116,auVar114);
              if (fVar285 < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar179);
                local_b00._0_16_ = auVar114;
                local_9a0._0_16_ = auVar81;
                local_a80._0_4_ = fVar200;
                local_aa0._0_16_ = auVar139;
                fVar179 = sqrtf(fVar285);
                auVar273 = ZEXT1664(local_ae0._0_16_);
                auVar269 = ZEXT464(auVar180._0_4_);
                auVar133 = ZEXT464(auVar135._0_4_);
                uVar67 = extraout_RAX_06;
                fVar200 = (float)local_a80._0_4_;
                auVar139 = local_aa0._0_16_;
                auVar114 = local_b00._0_16_;
                auVar81 = local_9a0._0_16_;
              }
              else {
                auVar135 = vsqrtss_avx(auVar76,auVar76);
                fVar179 = auVar135._0_4_;
              }
              auVar227 = ZEXT1664(auVar116);
              auVar262 = ZEXT1664(auVar181);
              auVar135 = vpermilps_avx(local_960._0_16_,0xff);
              fVar179 = fVar179 - auVar135._0_4_;
              auVar76 = vshufps_avx(auVar181,auVar181,0xff);
              auVar135 = vfmsub213ss_fma(auVar81,ZEXT416((uint)fVar200),auVar76);
              auVar169._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
              auVar169._8_4_ = auVar114._8_4_ ^ 0x80000000;
              auVar169._12_4_ = auVar114._12_4_ ^ 0x80000000;
              auVar188._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
              auVar188._8_4_ = auVar135._8_4_ ^ 0x80000000;
              auVar188._12_4_ = auVar135._12_4_ ^ 0x80000000;
              auVar139 = ZEXT416((uint)(auVar139._0_4_ * fVar200));
              auVar180 = auVar273._0_16_;
              auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar114._0_4_ * auVar135._0_4_)),auVar180,
                                        auVar139);
              auVar215 = ZEXT1664(auVar81);
              auVar135 = vinsertps_avx(auVar188,auVar139,0x1c);
              uVar74 = auVar81._0_4_;
              auVar189._4_4_ = uVar74;
              auVar189._0_4_ = uVar74;
              auVar189._8_4_ = uVar74;
              auVar189._12_4_ = uVar74;
              auVar135 = vdivps_avx(auVar135,auVar189);
              auVar81 = vinsertps_avx(auVar180,auVar169,0x10);
              auVar81 = vdivps_avx(auVar81,auVar189);
              auVar145._0_4_ = fVar250 * auVar135._0_4_ + fVar179 * auVar81._0_4_;
              auVar145._4_4_ = fVar250 * auVar135._4_4_ + fVar179 * auVar81._4_4_;
              auVar145._8_4_ = fVar250 * auVar135._8_4_ + fVar179 * auVar81._8_4_;
              auVar145._12_4_ = fVar250 * auVar135._12_4_ + fVar179 * auVar81._12_4_;
              auVar135 = vsubps_avx(auVar239,auVar145);
              auVar247 = ZEXT1664(auVar135);
              auVar239 = vandps_avx(auVar116,auVar231);
              if (auVar239._0_4_ < auVar269._0_4_) {
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar269._0_4_ + auVar133._0_4_)),
                                          local_9c0._0_16_,ZEXT416(0x36000000));
                auVar239 = vandps_avx(ZEXT416((uint)fVar179),auVar231);
                if (auVar239._0_4_ < auVar81._0_4_) {
                  bVar72 = uVar70 < 5;
                  fVar179 = auVar135._0_4_ + (float)local_a30._0_4_;
                  if (fVar179 < fVar73) {
                    bVar62 = 0;
                    goto LAB_0111f68d;
                  }
                  fVar198 = *(float *)(ray + k * 4 + 0x100);
                  auVar269 = ZEXT464((uint)fVar198);
                  if (fVar179 <= fVar198) {
                    auVar239 = vmovshdup_avx(auVar135);
                    bVar62 = 0;
                    if ((auVar239._0_4_ < 0.0) || (1.0 < auVar239._0_4_)) goto LAB_0111f68d;
                    auVar77 = vrsqrtss_avx(auVar77,auVar77);
                    fVar200 = auVar77._0_4_;
                    auVar215 = ZEXT464((uint)(fVar199 * -0.5));
                    pGVar2 = (context->scene->geometries).items[uVar69].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar62 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_0111f68d;
                      fVar199 = fVar200 * 1.5 + fVar199 * -0.5 * fVar200 * fVar200 * fVar200;
                      local_b80 = auVar115._0_4_;
                      fStack_b7c = auVar115._4_4_;
                      fStack_b78 = auVar115._8_4_;
                      fStack_b74 = auVar115._12_4_;
                      auVar170._0_4_ = fVar199 * local_b80;
                      auVar170._4_4_ = fVar199 * fStack_b7c;
                      auVar170._8_4_ = fVar199 * fStack_b78;
                      auVar170._12_4_ = fVar199 * fStack_b74;
                      auVar139 = vfmadd213ps_fma(auVar76,auVar170,auVar181);
                      auVar77 = vshufps_avx(auVar170,auVar170,0xc9);
                      auVar115 = vshufps_avx(auVar181,auVar181,0xc9);
                      auVar171._0_4_ = auVar170._0_4_ * auVar115._0_4_;
                      auVar171._4_4_ = auVar170._4_4_ * auVar115._4_4_;
                      auVar171._8_4_ = auVar170._8_4_ * auVar115._8_4_;
                      auVar171._12_4_ = auVar170._12_4_ * auVar115._12_4_;
                      auVar81 = vfmsub231ps_fma(auVar171,auVar181,auVar77);
                      auVar77 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar115 = vshufps_avx(auVar139,auVar139,0xc9);
                      auVar215 = ZEXT1664(auVar115);
                      auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                      auVar88._0_4_ = auVar139._0_4_ * auVar81._0_4_;
                      auVar88._4_4_ = auVar139._4_4_ * auVar81._4_4_;
                      auVar88._8_4_ = auVar139._8_4_ * auVar81._8_4_;
                      auVar88._12_4_ = auVar139._12_4_ * auVar81._12_4_;
                      auVar77 = vfmsub231ps_fma(auVar88,auVar77,auVar115);
                      local_540 = auVar239._0_8_;
                      auVar239 = vmovshdup_avx(auVar77);
                      local_5a0._8_8_ = auVar239._0_8_;
                      auVar239 = vshufps_avx(auVar77,auVar77,0xaa);
                      local_580 = auVar239._0_8_;
                      local_560 = auVar77._0_4_;
                      local_5a0._0_8_ = local_5a0._8_8_;
                      local_5a0._16_8_ = local_5a0._8_8_;
                      local_5a0._24_8_ = local_5a0._8_8_;
                      uStack_578 = local_580;
                      uStack_570 = local_580;
                      uStack_568 = local_580;
                      uStack_55c = local_560;
                      uStack_558 = local_560;
                      uStack_554 = local_560;
                      uStack_550 = local_560;
                      uStack_54c = local_560;
                      uStack_548 = local_560;
                      uStack_544 = local_560;
                      uStack_538 = local_540;
                      uStack_530 = local_540;
                      uStack_528 = local_540;
                      auVar146._12_4_ = 0;
                      auVar146._0_12_ = ZEXT812(0);
                      auVar146 = auVar146 << 0x20;
                      local_520 = ZEXT1232(ZEXT812(0)) << 0x20;
                      local_500 = CONCAT44(uStack_7fc,local_800);
                      uStack_4f8 = CONCAT44(uStack_7f4,uStack_7f8);
                      uStack_4f0 = CONCAT44(uStack_7ec,uStack_7f0);
                      uStack_4e8 = CONCAT44(uStack_7e4,uStack_7e8);
                      local_4e0._4_4_ = uStack_7dc;
                      local_4e0._0_4_ = local_7e0;
                      local_4e0._8_4_ = uStack_7d8;
                      local_4e0._12_4_ = uStack_7d4;
                      local_4e0._16_4_ = uStack_7d0;
                      local_4e0._20_4_ = uStack_7cc;
                      local_4e0._24_4_ = uStack_7c8;
                      local_4e0._28_4_ = uStack_7c4;
                      vpcmpeqd_avx2(local_4e0,local_4e0);
                      local_4c0 = context->user->instID[0];
                      uStack_4bc = local_4c0;
                      uStack_4b8 = local_4c0;
                      uStack_4b4 = local_4c0;
                      uStack_4b0 = local_4c0;
                      uStack_4ac = local_4c0;
                      uStack_4a8 = local_4c0;
                      uStack_4a4 = local_4c0;
                      local_4a0 = context->user->instPrimID[0];
                      uStack_49c = local_4a0;
                      uStack_498 = local_4a0;
                      uStack_494 = local_4a0;
                      uStack_490 = local_4a0;
                      uStack_48c = local_4a0;
                      uStack_488 = local_4a0;
                      uStack_484 = local_4a0;
                      *(float *)(ray + k * 4 + 0x100) = fVar179;
                      local_a60 = local_820;
                      local_b50.valid = (int *)local_a60;
                      local_b50.geometryUserPtr = pGVar2->userPtr;
                      local_b50.context = context->user;
                      local_b50.hit = (RTCHitN *)local_5a0;
                      local_b50.N = 8;
                      local_b50.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar215 = ZEXT1664(auVar115);
                        auVar227 = ZEXT1664(auVar116);
                        auVar247 = ZEXT1664(auVar135);
                        auVar262 = ZEXT1664(auVar181);
                        auVar273 = ZEXT1664(auVar180);
                        (*pGVar2->occlusionFilterN)(&local_b50);
                        auVar146 = ZEXT816(0) << 0x40;
                      }
                      auVar152 = ZEXT1632(auVar146);
                      auVar91 = vpcmpeqd_avx2(local_a60,auVar152);
                      auVar91 = _DAT_01f7b020 & ~auVar91;
                      if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar91 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar91 >> 0x7f,0) != '\0') ||
                            (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar91 >> 0xbf,0) != '\0') ||
                          (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar91[0x1f] < '\0') {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar215 = ZEXT1664(auVar215._0_16_);
                          auVar227 = ZEXT1664(auVar227._0_16_);
                          auVar247 = ZEXT1664(auVar247._0_16_);
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          auVar273 = ZEXT1664(auVar273._0_16_);
                          (*p_Var3)(&local_b50);
                          auVar152 = ZEXT832(0) << 0x40;
                        }
                        auVar269 = ZEXT464((uint)fVar198);
                        auVar152 = vpcmpeqd_avx2(local_a60,auVar152);
                        auVar131._8_4_ = 0xff800000;
                        auVar131._0_8_ = 0xff800000ff800000;
                        auVar131._12_4_ = 0xff800000;
                        auVar131._16_4_ = 0xff800000;
                        auVar131._20_4_ = 0xff800000;
                        auVar131._24_4_ = 0xff800000;
                        auVar131._28_4_ = 0xff800000;
                        auVar91 = vblendvps_avx(auVar131,*(undefined1 (*) [32])
                                                          (local_b50.ray + 0x100),auVar152);
                        *(undefined1 (*) [32])(local_b50.ray + 0x100) = auVar91;
                        auVar91 = _DAT_01f7b020 & ~auVar152;
                        if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar91 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar91 >> 0x7f,0) != '\0') ||
                              (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar91 >> 0xbf,0) != '\0') ||
                            (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar91[0x1f] < '\0') {
                          bVar62 = 1;
                          goto LAB_0111f68d;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar198;
                    }
                  }
                  auVar269 = ZEXT464((uint)fVar198);
                  bVar62 = 0;
                  goto LAB_0111f68d;
                }
              }
              uVar70 = uVar70 + 1;
            }
            bVar72 = false;
LAB_0111f68d:
            uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar193._4_4_ = uVar74;
            auVar193._0_4_ = uVar74;
            auVar193._8_4_ = uVar74;
            auVar193._12_4_ = uVar74;
            auVar193._16_4_ = uVar74;
            auVar193._20_4_ = uVar74;
            auVar193._24_4_ = uVar74;
            auVar193._28_4_ = uVar74;
            bVar71 = bVar71 | bVar72 & bVar62;
            auVar91 = vcmpps_avx(_local_b20,auVar193,2);
          }
          auVar132._0_4_ = fVar106 + local_5e0._0_4_;
          auVar132._4_4_ = fVar106 + local_5e0._4_4_;
          auVar132._8_4_ = fVar106 + local_5e0._8_4_;
          auVar132._12_4_ = fVar106 + local_5e0._12_4_;
          auVar132._16_4_ = fVar106 + local_5e0._16_4_;
          auVar132._20_4_ = fVar106 + local_5e0._20_4_;
          auVar132._24_4_ = fVar106 + local_5e0._24_4_;
          auVar132._28_4_ = fVar106 + local_5e0._28_4_;
          uVar74 = auVar193._0_4_;
          auVar177._4_4_ = uVar74;
          auVar177._0_4_ = uVar74;
          auVar177._8_4_ = uVar74;
          auVar177._12_4_ = uVar74;
          auVar177._16_4_ = uVar74;
          auVar177._20_4_ = uVar74;
          auVar177._24_4_ = uVar74;
          auVar177._28_4_ = uVar74;
          auVar91 = vcmpps_avx(auVar132,auVar177,2);
          auVar101 = vandps_avx(local_880,local_860);
          auVar101 = vandps_avx(auVar91,auVar101);
          auVar197._0_4_ = fVar106 + local_480._0_4_;
          auVar197._4_4_ = fVar106 + local_480._4_4_;
          auVar197._8_4_ = fVar106 + local_480._8_4_;
          auVar197._12_4_ = fVar106 + local_480._12_4_;
          auVar197._16_4_ = fVar106 + local_480._16_4_;
          auVar197._20_4_ = fVar106 + local_480._20_4_;
          auVar197._24_4_ = fVar106 + local_480._24_4_;
          auVar197._28_4_ = fVar106 + local_480._28_4_;
          auVar91 = vcmpps_avx(auVar197,auVar177,2);
          auVar90 = vandps_avx(_local_9e0,auVar90);
          auVar90 = vandps_avx(auVar91,auVar90);
          auVar90 = vorps_avx(auVar101,auVar90);
          if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar90 >> 0x7f,0) != '\0') ||
                (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar90 >> 0xbf,0) != '\0') ||
              (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar90[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar65 * 0x60) = auVar90;
            auVar90 = vblendvps_avx(_local_480,local_5e0,auVar101);
            *(undefined1 (*) [32])(auStack_160 + uVar65 * 0x60) = auVar90;
            uVar67 = vmovlps_avx(local_830);
            (&uStack_140)[uVar65 * 0xc] = uVar67;
            aiStack_138[uVar65 * 0x18] = local_d6c + 1;
            uVar65 = (ulong)((int)uVar65 + 1);
          }
        }
      }
    }
    while( true ) {
      uVar64 = (uint)uVar65;
      if (uVar64 == 0) {
        if (bVar71 != 0) goto LAB_0111fb7c;
        uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar89._4_4_ = uVar74;
        auVar89._0_4_ = uVar74;
        auVar89._8_4_ = uVar74;
        auVar89._12_4_ = uVar74;
        auVar4 = vcmpps_avx(local_840,auVar89,2);
        uVar69 = vmovmskps_avx(auVar4);
        uVar69 = (uint)local_a10 & uVar69;
        goto LAB_0111d3d8;
      }
      uVar65 = (ulong)(uVar64 - 1);
      lVar66 = uVar65 * 0x60;
      auVar90 = *(undefined1 (*) [32])(auStack_160 + lVar66);
      auVar100._0_4_ = fVar106 + auVar90._0_4_;
      auVar100._4_4_ = fVar106 + auVar90._4_4_;
      auVar100._8_4_ = fVar106 + auVar90._8_4_;
      auVar100._12_4_ = fVar106 + auVar90._12_4_;
      auVar100._16_4_ = fVar106 + auVar90._16_4_;
      auVar100._20_4_ = fVar106 + auVar90._20_4_;
      auVar100._24_4_ = fVar106 + auVar90._24_4_;
      auVar100._28_4_ = fVar106 + auVar90._28_4_;
      uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar175._4_4_ = uVar74;
      auVar175._0_4_ = uVar74;
      auVar175._8_4_ = uVar74;
      auVar175._12_4_ = uVar74;
      auVar175._16_4_ = uVar74;
      auVar175._20_4_ = uVar74;
      auVar175._24_4_ = uVar74;
      auVar175._28_4_ = uVar74;
      auVar91 = vcmpps_avx(auVar100,auVar175,2);
      auVar101 = vandps_avx(auVar91,*(undefined1 (*) [32])(auStack_180 + lVar66));
      local_5a0 = auVar101;
      auVar91 = *(undefined1 (*) [32])(auStack_180 + lVar66) & auVar91;
      if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar91 >> 0x7f,0) != '\0') ||
            (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar91 >> 0xbf,0) != '\0') ||
          (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar91[0x1f] < '\0') break;
      uVar65 = (ulong)(uVar64 - 1);
    }
    auVar149._8_4_ = 0x7f800000;
    auVar149._0_8_ = 0x7f8000007f800000;
    auVar149._12_4_ = 0x7f800000;
    auVar149._16_4_ = 0x7f800000;
    auVar149._20_4_ = 0x7f800000;
    auVar149._24_4_ = 0x7f800000;
    auVar149._28_4_ = 0x7f800000;
    auVar90 = vblendvps_avx(auVar149,auVar90,auVar101);
    auVar91 = vshufps_avx(auVar90,auVar90,0xb1);
    auVar91 = vminps_avx(auVar90,auVar91);
    auVar152 = vshufpd_avx(auVar91,auVar91,5);
    auVar91 = vminps_avx(auVar91,auVar152);
    auVar152 = vpermpd_avx2(auVar91,0x4e);
    auVar91 = vminps_avx(auVar91,auVar152);
    auVar90 = vcmpps_avx(auVar90,auVar91,0);
    auVar91 = auVar101 & auVar90;
    if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar91 >> 0x7f,0) != '\0') ||
          (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar91 >> 0xbf,0) != '\0') ||
        (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar91[0x1f] < '\0')
    {
      auVar101 = vandps_avx(auVar90,auVar101);
    }
    uVar68 = vmovmskps_avx(auVar101);
    iVar63 = 0;
    for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
      iVar63 = iVar63 + 1;
    }
    *(undefined4 *)(local_5a0 + (uint)(iVar63 << 2)) = 0;
    uVar67 = (&uStack_140)[uVar65 * 0xc];
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar67;
    local_d6c = aiStack_138[uVar65 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar66) = local_5a0;
    uVar68 = uVar64 - 1;
    if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_5a0 >> 0x7f,0) != '\0') ||
          (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_5a0 >> 0xbf,0) != '\0') ||
        (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5a0[0x1f] < '\0') {
      uVar68 = uVar64;
    }
    uVar74 = (undefined4)uVar67;
    auVar124._4_4_ = uVar74;
    auVar124._0_4_ = uVar74;
    auVar124._8_4_ = uVar74;
    auVar124._12_4_ = uVar74;
    auVar124._16_4_ = uVar74;
    auVar124._20_4_ = uVar74;
    auVar124._24_4_ = uVar74;
    auVar124._28_4_ = uVar74;
    auVar239 = vmovshdup_avx(auVar79);
    auVar239 = vsubps_avx(auVar239,auVar79);
    auVar102._0_4_ = auVar239._0_4_;
    auVar102._4_4_ = auVar102._0_4_;
    auVar102._8_4_ = auVar102._0_4_;
    auVar102._12_4_ = auVar102._0_4_;
    auVar102._16_4_ = auVar102._0_4_;
    auVar102._20_4_ = auVar102._0_4_;
    auVar102._24_4_ = auVar102._0_4_;
    auVar102._28_4_ = auVar102._0_4_;
    auVar239 = vfmadd132ps_fma(auVar102,auVar124,_DAT_01f7b040);
    local_5e0 = ZEXT1632(auVar239);
    auVar133 = ZEXT864(*(ulong *)(local_5e0 + (uint)(iVar63 << 2)));
    uVar65 = (ulong)uVar68;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }